

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_schnorrsig_tests(void)

{
  byte *pbVar1;
  MUSIG_ERROR MVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  _func_void_char_ptr_void_ptr *p_Var143;
  void *pvVar144;
  undefined1 auVar145 [16];
  uint64_t uVar146;
  int iVar147;
  uint32_t uVar148;
  uint32_t uVar149;
  int iVar150;
  uint uVar151;
  long lVar152;
  musig_sign_verify_vector *pmVar153;
  ulong uVar154;
  long lVar155;
  uchar *puVar156;
  ulong uVar157;
  ulong uVar158;
  ulong uVar159;
  bool bVar160;
  size_t in_RCX;
  secp256k1_keypair *keypair;
  uchar *msg32;
  bool bVar161;
  secp256k1_musig_secnonce *psVar162;
  ulong uVar163;
  char cVar164;
  uint uVar165;
  secp256k1_schnorrsig_extraparams *extraparams;
  musig_sign_verify_vector *pmVar167;
  musig_sig_agg_vector *pmVar168;
  musig_tweak_vector *sha2;
  ulong uVar169;
  code *unaff_RBP;
  musig_sign_verify_vector *pubnonce;
  ulong uVar170;
  secp256k1_musig_pubnonce *nonce_00;
  secp256k1_musig_partial_sig *sig;
  ulong uVar171;
  ulong uVar172;
  secp256k1_context *psVar173;
  secp256k1_context *psVar174;
  musig_sign_verify_vector *pmVar175;
  size_t in_R8;
  long *plVar176;
  ulong uVar177;
  ulong uVar178;
  secp256k1_context *pubkey;
  musig_key_agg_vector *pmVar179;
  musig_sign_verify_vector *keyagg_cache;
  ulong uVar180;
  secp256k1_context *psVar181;
  code *r;
  musig_sign_verify_vector *cache_i;
  musig_sign_verify_vector *pmVar182;
  ulong uVar183;
  ulong uVar184;
  secp256k1_context *keypair_00;
  musig_nonce_agg_vector *keyagg_cache_00;
  musig_sign_verify_vector *pmVar185;
  byte bVar186;
  code *pubkey_00;
  musig_sign_verify_vector *nonce_01;
  ulong uVar187;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar *args [5];
  uchar nonce_z [32];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  secp256k1_fe sStackY_e48;
  musig_sign_verify_vector *pmStackY_e20;
  musig_sign_verify_vector *pmStackY_e18;
  musig_sign_verify_vector *pmStackY_e10;
  musig_sign_verify_vector *pmStackY_e08;
  musig_sign_verify_vector *pmStackY_e00;
  musig_sign_verify_vector *pmStackY_df8;
  secp256k1_musig_partial_sig asStack_da0 [2];
  ulong uStack_d50;
  secp256k1_musig_secnonce *psStack_d48;
  int aiStack_d40 [2];
  uchar auStack_d38 [8];
  uchar auStack_d30 [8];
  uchar auStack_d28 [40];
  secp256k1_keypair sStack_d00;
  undefined1 auStack_c70 [40];
  uint64_t uStack_c48;
  uint64_t uStack_c40;
  uint64_t uStack_c38;
  undefined1 auStack_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined1 auStack_bc0 [16];
  undefined1 auStack_bb0 [128];
  undefined1 auStack_b30 [40];
  uint64_t uStack_b08;
  uint64_t uStack_b00;
  uint64_t uStack_af8;
  uint64_t uStack_af0;
  uint64_t uStack_ae8;
  uint64_t uStack_ae0;
  uint64_t uStack_ad8;
  undefined1 auStack_a60 [16];
  uint64_t uStack_a50;
  uint64_t uStack_a48;
  undefined1 auStack_a20 [32];
  undefined1 auStack_a00 [96];
  undefined1 auStack_9a0 [64];
  undefined1 auStack_960 [40];
  ulong auStack_938 [3];
  undefined1 auStack_920 [64];
  undefined1 auStack_8e0 [4];
  undefined1 auStack_8dc [124];
  secp256k1_scalar asStack_860 [2];
  secp256k1_scalar asStack_820 [7];
  undefined1 auStack_740 [64];
  undefined1 auStack_700 [8];
  secp256k1_keypair *psStack_6f8;
  uchar *puStack_6f0;
  uchar *puStack_6e8;
  uchar *puStack_6e0;
  secp256k1_musig_partial_sig *psStack_6d8;
  uint64_t uStack_6d0;
  uint64_t uStack_6c8;
  uint64_t uStack_6c0;
  uint64_t uStack_6b8;
  uint64_t uStack_6b0;
  uint64_t uStack_6a8;
  uchar auStack_6a0 [36];
  secp256k1_musig_secnonce asStack_67c [3];
  undefined1 auStack_4c0 [144];
  secp256k1_context *psStack_430;
  secp256k1_context *psStack_428;
  secp256k1_context *psStack_420;
  secp256k1_context *psStack_418;
  code *pcStack_410;
  undefined1 local_3ec [12];
  void *pvStack_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  undefined1 local_398 [56];
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [72];
  _func_void_char_ptr_void_ptr *p_Stack_2f0;
  void *local_2e8;
  _func_void_char_ptr_void_ptr *p_Stack_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [48];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_228 [40];
  _func_void_char_ptr_void_ptr *p_Stack_200;
  void *local_1f8;
  uint64_t uStack_1f0;
  undefined1 local_1e8 [64];
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  secp256k1_schnorrsig_extraparams local_a8 [4];
  undefined1 local_48 [16];
  void *local_38;
  secp256k1_schnorrsig_extraparams *psVar166;
  
  local_398._40_8_ = local_398._32_8_;
  psVar181 = (secp256k1_context *)local_3b8;
  local_3b8[8] = 'n';
  local_3b8[9] = 'o';
  local_3b8[10] = 'n';
  local_3b8[0xb] = 'c';
  local_3b8[0xc] = 'e';
  local_3b8[0] = 'B';
  local_3b8[1] = 'I';
  local_3b8[2] = 'P';
  local_3b8[3] = '0';
  local_3b8._4_4_ = 0x2f303433;
  pcStack_410 = (code *)0x14e39e;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = (void *)0xf4bfbff746615b35;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  local_228._16_8_ = (void *)0x5735866160217180;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x68b07b4c21a29e54;
  local_1e8._32_8_ = (void *)0x40;
  pcStack_410 = (code *)0x14e3d2;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  pcStack_410 = (code *)0x14e3e6;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonce",0xb);
  local_228._0_8_ = (void *)0x4eba7e7024dd3219;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  local_228._16_8_ = (void *)0x4c44df973afbe4b1;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x249e850a4aac2739;
  local_1e8._32_8_ = (void *)0x40;
  pcStack_410 = (code *)0x14e40e;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  pcStack_410 = (code *)0x14e41e;
  testrand256((uchar *)local_2b8);
  pubkey_00 = (code *)(local_338 + 0x40);
  pcStack_410 = (code *)0x14e42e;
  testrand256((uchar *)pubkey_00);
  pubkey = (secp256k1_context *)local_2d8;
  pcStack_410 = (code *)0x14e43e;
  testrand256((uchar *)pubkey);
  psVar166 = (secp256k1_schnorrsig_extraparams *)local_3d8;
  pcStack_410 = (code *)0x14e44b;
  testrand256((uchar *)psVar166);
  keypair_00 = (secp256k1_context *)local_2b8;
  local_398._16_8_ = pubkey;
  local_398._24_8_ = psVar181;
  local_398._0_8_ = (secp256k1_context *)local_2b8;
  local_398._8_8_ = pubkey_00;
  local_398._32_8_ = psVar166;
  if (0 < COUNT) {
    keypair_00 = (secp256k1_context *)local_398;
    psVar166 = (secp256k1_schnorrsig_extraparams *)0x0;
    do {
      pcStack_410 = (code *)0x14e48c;
      nonce_function_bip340_bitflip((uchar **)keypair_00,0,0x20,in_RCX,in_R8);
      pcStack_410 = (code *)0x14e49e;
      nonce_function_bip340_bitflip((uchar **)keypair_00,1,0x20,in_RCX,in_R8);
      pcStack_410 = (code *)0x14e4b0;
      nonce_function_bip340_bitflip((uchar **)keypair_00,2,0x20,in_RCX,in_R8);
      pcStack_410 = (code *)0x14e4c2;
      nonce_function_bip340_bitflip((uchar **)keypair_00,3,0xd,in_RCX,in_R8);
      pcStack_410 = (code *)0x14e4d4;
      nonce_function_bip340_bitflip((uchar **)keypair_00,3,0xd,in_RCX,in_R8);
      pcStack_410 = (code *)0x14e4e6;
      nonce_function_bip340_bitflip((uchar **)keypair_00,4,0x20,in_RCX,in_R8);
      uVar165 = (int)psVar166 + 1;
      psVar166 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar165;
    } while ((int)uVar165 < COUNT);
  }
  pcStack_410 = (code *)0x14e530;
  iVar147 = nonce_function_bip340
                      (local_288,local_2b8,0x20,local_338 + 0x40,local_2d8,local_3b8,0xd,(void *)0x0
                      );
  if (iVar147 == 0) goto LAB_001508f7;
  keypair_00 = (secp256k1_context *)local_3b8;
  pcStack_410 = (code *)0x14e54a;
  testrand_bytes_test((uchar *)keypair_00,0xd);
  pcStack_410 = (code *)0x14e588;
  iVar147 = nonce_function_bip340
                      (local_288,local_2b8,0x20,local_338 + 0x40,local_2d8,(uchar *)keypair_00,0xd,
                       (void *)0x0);
  if (iVar147 == 0) goto LAB_001508fc;
  if (0 < COUNT) {
    psVar166 = (secp256k1_schnorrsig_extraparams *)0x0;
    keypair_00 = (secp256k1_context *)local_338;
    pubkey_00 = (code *)local_2b8;
    pubkey = (secp256k1_context *)(local_338 + 0x40);
    psVar181 = (secp256k1_context *)local_2d8;
    unaff_RBP = (code *)local_3b8;
    do {
      pcStack_410 = (code *)0x14e5ce;
      uVar148 = testrand_int(0x1f);
      pcStack_410 = (code *)0x14e5f9;
      iVar147 = nonce_function_bip340
                          ((uchar *)keypair_00,(uchar *)pubkey_00,(ulong)(uVar148 & 0x1f),
                           (uchar *)pubkey,(uchar *)psVar181,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar147 == 0) goto LAB_0015084d;
      lVar152 = 0;
      while (local_288[lVar152] == local_338[lVar152]) {
        lVar152 = lVar152 + 1;
        if (lVar152 == 0x20) goto LAB_001508ed;
      }
      pcStack_410 = (code *)0x14e62b;
      uVar148 = testrand_int(0xc);
      pcStack_410 = (code *)0x14e672;
      iVar147 = nonce_function_bip340
                          ((uchar *)keypair_00,(uchar *)pubkey_00,0x20,(uchar *)pubkey,
                           (uchar *)psVar181,(uchar *)unaff_RBP,((ulong)uVar148 + 0xd) % 0xd,
                           (void *)0x0);
      extraparams = psVar166;
      if (iVar147 == 0) goto LAB_00150852;
      lVar152 = 0;
      while (local_288[lVar152] == local_338[lVar152]) {
        lVar152 = lVar152 + 1;
        if (lVar152 == 0x20) goto LAB_001508f2;
      }
      uVar165 = (int)psVar166 + 1;
      psVar166 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar165;
    } while ((int)uVar165 < COUNT);
  }
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  pcStack_410 = (code *)0x14e6f9;
  iVar147 = nonce_function_bip340
                      (local_338,local_2b8,0x20,local_338 + 0x40,local_2d8,local_3b8,0xd,local_3d8);
  if (iVar147 == 0) goto LAB_00150901;
  pcStack_410 = (code *)0x14e741;
  iVar147 = nonce_function_bip340
                      (local_288,local_2b8,0x20,local_338 + 0x40,local_2d8,local_3b8,0xd,(void *)0x0
                      );
  extraparams = psVar166;
  if (iVar147 == 0) goto LAB_00150906;
  lVar152 = 0;
  do {
    if (local_338[lVar152] != local_288[lVar152]) goto LAB_00150a78;
    lVar152 = lVar152 + 1;
  } while (lVar152 != 0x20);
  local_348 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  stack0xfffffffffffffc98 = (undefined1  [16])0x0;
  local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  local_398._40_8_ = 0;
  local_398._16_8_ = (secp256k1_context *)0x0;
  local_398._24_8_ = (secp256k1_context *)0x0;
  local_398._0_8_ = (secp256k1_context *)0x0;
  local_398._8_8_ = (secp256k1_context *)0x0;
  local_3b8._16_8_ = (void *)0x0;
  local_3b8[0] = 0xda;
  local_3b8[1] = 'o';
  local_3b8[2] = 0xb3;
  local_3b8[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8[8] = '\0';
  local_3b8[9] = '\0';
  local_3b8[10] = '\0';
  local_3b8[0xb] = '\0';
  local_3b8[0xc] = '\0';
  local_3b8[0xd] = '\0';
  local_3b8[0xe] = '\0';
  local_3b8[0xf] = '\0';
  local_48 = (undefined1  [16])0x0;
  local_38 = (void *)0x0;
  extraparams = (secp256k1_schnorrsig_extraparams *)local_2b8;
  pcStack_410 = (code *)0x14e7dc;
  testrand256((uchar *)extraparams);
  pcStack_410 = (code *)0x14e7e9;
  testrand256(local_338 + 0x40);
  pcStack_410 = (code *)0x14e7f6;
  testrand256(local_2d8);
  pcStack_410 = (code *)0x14e800;
  testrand256(local_3d8);
  pcStack_410 = (code *)0x14e817;
  iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)extraparams);
  if (iVar147 == 0) goto LAB_0015090b;
  keypair_00 = (secp256k1_context *)(local_168 + 0x60);
  pcStack_410 = (code *)0x14e83e;
  iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair_00,local_338 + 0x40);
  if (iVar147 == 0) goto LAB_00150910;
  extraparams = (secp256k1_schnorrsig_extraparams *)(local_168 + 0xc0);
  pcStack_410 = (code *)0x14e865;
  iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)extraparams,local_2d8);
  if (iVar147 == 0) goto LAB_00150915;
  pcStack_410 = (code *)0x14e88b;
  iVar147 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                       (secp256k1_keypair *)local_168);
  if (iVar147 == 0) goto LAB_0015091a;
  pcStack_410 = (code *)0x14e8ac;
  iVar147 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)(local_228 + 0x40),(int *)0x0,
                       (secp256k1_keypair *)keypair_00);
  if (iVar147 == 0) goto LAB_0015091f;
  pcStack_410 = (code *)0x14e8cd;
  iVar147 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,(secp256k1_keypair *)extraparams);
  if (iVar147 == 0) goto LAB_00150924;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  pcStack_410 = (code *)0x14e932;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar174 = CTX;
  if (iVar147 == 0) goto LAB_00150929;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  keypair_00 = &secp256k1_context_static_;
  if (CTX == &secp256k1_context_static_) goto LAB_0015092e;
  pubkey_00 = counting_callback_fn;
  (CTX->illegal_callback).fn = counting_callback_fn;
  extraparams = (secp256k1_schnorrsig_extraparams *)local_3ec;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14e9a7;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (psVar174,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150933;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150938;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_0015093d;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14ea26;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (psVar174,local_338,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150942;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150947;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_0015094c;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14eaa3;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)0x0,
                       nonce_function_bip340,(void *)0x0);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150951;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150956;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_0015095b;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14eb22;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)local_398,
                       nonce_function_bip340,(void *)0x0);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150960;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  psVar174 = STATIC_CTX;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150965;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (STATIC_CTX->illegal_callback).fn;
  pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
  if (STATIC_CTX == &secp256k1_context_static_) goto LAB_0015096a;
  (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14eba8;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar174 = STATIC_CTX;
  if (iVar147 != 0) goto LAB_0015096f;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150974;
  pcStack_410 = (code *)0x14ebf9;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = CTX;
  if (iVar147 == 0) goto LAB_00150979;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_0015097e;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14ec51;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150983;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150988;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_0015098d;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14ecc6;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,local_338,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150992;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150997;
  pcStack_410 = (code *)0x14ed0a;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,local_338,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = CTX;
  if (iVar147 == 0) goto LAB_0015099c;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_001509a1;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14ed63;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)0x0,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_001509a6;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_001509ab;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_001509b0;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14edd8;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)local_398,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_001509b5;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_001509ba;
  pcStack_410 = (code *)0x14ee28;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
  psVar174 = CTX;
  if (iVar147 == 0) goto LAB_001509bf;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_001509c4;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14ee89;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       (secp256k1_schnorrsig_extraparams *)local_48);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_001509c9;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  psVar174 = STATIC_CTX;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_001509ce;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (STATIC_CTX->illegal_callback).fn;
  pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
  if (STATIC_CTX == &secp256k1_context_static_) goto LAB_001509d3;
  (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14ef05;
  iVar147 = secp256k1_schnorrsig_sign_custom
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       (secp256k1_schnorrsig_extraparams *)local_3b8);
  psVar174 = STATIC_CTX;
  if (iVar147 != 0) goto LAB_001509d8;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_001509dd;
  pcStack_410 = (code *)0x14ef60;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  if (iVar147 == 0) goto LAB_001509e2;
  pcStack_410 = (code *)0x14ef8e;
  psVar173 = CTX;
  iVar147 = secp256k1_schnorrsig_verify
                      (CTX,local_338,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
  psVar174 = CTX;
  if (iVar147 == 0) goto LAB_001509e7;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_001509ec;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14efd0;
  counting_callback_fn((char *)psVar173,extraparams);
  psVar174 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_001509f1;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_001509f6;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14f024;
  counting_callback_fn((char *)psVar173,extraparams);
  psVar174 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_001509fb;
  pcStack_410 = (code *)0x14f05b;
  iVar147 = secp256k1_schnorrsig_verify
                      (psVar174,local_338,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228);
  psVar173 = CTX;
  if (iVar147 != 0) goto LAB_00150a00;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_00150a05;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar173->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14f09d;
  counting_callback_fn((char *)psVar174,extraparams);
  psVar174 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150a0a;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar174->illegal_callback).fn;
  pvStack_3e0 = (psVar174->illegal_callback).data;
  if (psVar174 == &secp256k1_context_static_) goto LAB_00150a0f;
  (psVar174->illegal_callback).fn = counting_callback_fn;
  (psVar174->illegal_callback).data = extraparams;
  pcStack_410 = (code *)0x14f108;
  iVar147 = secp256k1_schnorrsig_verify
                      (psVar174,local_338,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_288);
  psVar174 = CTX;
  if (iVar147 != 0) goto LAB_00150a14;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar174->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00150a19;
  pcStack_410 = (code *)0x14f14a;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
  local_228._0_8_ = (void *)0x239253819cecba11;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
  local_228._16_8_ = (void *)0x3cc76597c87550;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x33e9b66a90f61164;
  local_1e8._32_8_ = (void *)0x40;
  pcStack_410 = (code *)0x14f17a;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  local_228._16_8_ = (void *)0x0;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x300000000000000;
  local_228._0_8_ = (void *)0x0;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  local_398._16_8_ = 0xb0996f8345c831b5;
  local_398._24_8_ = 0xf936e0bc13f10186;
  local_398._0_8_ = 0x10c35892018a30f9;
  local_398._8_8_ = 0x29529df8854f3449;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_338._16_8_ = (void *)0x0;
  local_338._24_8_ = 0;
  local_338._0_8_ = 0;
  local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  local_168._48_8_ = 0x472f17b2fde8eeeb;
  local_168._56_8_ = 0xc03605310d90f47d;
  local_168._32_8_ = 0x718bea854a6af625;
  local_168._40_8_ = 0xe52c2d384fa782e4;
  local_168._16_8_ = (void *)0x8b007835f1cdf4b;
  local_168._24_8_ = 0x1582ca2dcef1554c;
  local_168._0_8_ = (void *)0x108d84801f8307e9;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x361024401b37a569;
  pcStack_410 = (code *)0x14f22b;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_398,local_288,local_338,0x20,local_168);
  pcStack_410 = (code *)0x14f244;
  test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
  local_228._16_8_ = (void *)0x56dab4380f16e762;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xefcf905104d984a7;
  local_228._0_8_ = (void *)0x6a2aed8a6251e1b7;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
  local_398._16_8_ = 0xd8cedea21daefe58;
  local_398._24_8_ = 0x59a62b507b0f2443;
  local_398._0_8_ = 0x5f1c672a7fd7f1df;
  local_398._8_8_ = 0xbe4123db26371836;
  local_278._0_8_ = (void *)0x0;
  local_278._8_8_ = 0x100000000000000;
  local_288 = ZEXT816(0);
  local_338._16_8_ = (void *)0xd0319f29223809a4;
  local_338._24_8_ = 0x896c4eec98fa2e08;
  local_338._0_8_ = 0xd308a385886a3f24;
  local_338._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
  local_168._48_8_ = 0x1c87ea39b6fc7e89;
  local_168._56_8_ = 0xa4b9e33def695fa;
  local_168._32_8_ = 0xccab76c91ad10689;
  local_168._40_8_ = 0xeaf4bf9212090bb2;
  local_168._16_8_ = (void *)0x17f9436d3e41de1b;
  local_168._24_8_ = 0x4133de788ccf8ddc;
  local_168._0_8_ = (void *)0x6d29aeee60bd9668;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x7fe1df79f228ab4;
  pcStack_410 = (code *)0x14f311;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_398,local_288,local_338,0x20,local_168);
  pcStack_410 = (code *)0x14f32a;
  test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
  local_228._16_8_ = (void *)0x74cc678a084e0229;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xc9e5143ba6be0b02;
  local_228._0_8_ = (void *)0x34c26821a2da0fc9;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
  local_398._16_8_ = 0xc986b00953713901;
  local_398._24_8_ = 0xb84e7769d98fe160;
  local_398._0_8_ = 0x137e77c5fe8a30dd;
  local_398._8_8_ = 0xccb7c19c2ba71f12;
  local_278._8_8_ = 0x6d9e698d7620b4b;
  local_278._0_8_ = 0x2c69d1c6cd760e08;
  local_288._8_8_ = 0xccbcbbb5a235b02e;
  local_288._0_8_ = 0xaed7b42438a57ac8;
  local_338._16_8_ = (void *)0x33776cb5aa0598da;
  local_338._24_8_ = 0x5cb708a5d0b92430;
  local_338._0_8_ = 0x1adfbcb3d8582d7e;
  local_338._8_8_ = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
  local_168._48_8_ = 0x1e48f8828da9de7a;
  local_168._56_8_ = 0xb73f6f4a67031e0e;
  local_168._32_8_ = 0x4a95ada5795874ab;
  local_168._40_8_ = 0x3c1da5c3915ac472;
  local_168._16_8_ = (void *)0x8b8d72602acf9bc4;
  local_168._24_8_ = 0x1b3c31dd500f204c;
  local_168._0_8_ = (void *)0xb74bb4d7eeaa3158;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x94429dba94ab5e4e;
  psVar181 = (secp256k1_context *)local_228;
  pcStack_410 = (code *)0x14f3f3;
  test_schnorrsig_bip_vectors_check_signing
            ((uchar *)psVar181,local_398,local_288,local_338,0x20,local_168);
  pcStack_410 = (code *)0x14f40c;
  test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
  local_228._16_8_ = (void *)0x54a23fcf62307712;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x101740d28ef5449e;
  local_228._0_8_ = (void *)0x81739377262b430b;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
  local_398._16_8_ = 0x8a461df2fb950d3a;
  local_398._24_8_ = 0x17f5d860c1f8331b;
  local_398._0_8_ = 0x25f50551f9dfd125;
  local_398._8_8_ = 0xad96a928f622403c;
  local_278._8_4_ = 0xffffffff;
  local_278._0_8_ = 0xffffffffffffffff;
  local_278._12_4_ = 0xffffffff;
  local_288._8_4_ = 0xffffffff;
  local_288._0_8_ = 0xffffffffffffffff;
  local_288._12_4_ = 0xffffffff;
  local_338._16_8_ = (void *)0xffffffffffffffff;
  local_338._24_8_ = 0xffffffffffffffff;
  local_338._0_8_ = 0xffffffffffffffff;
  local_338._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
  local_168._48_8_ = 0x27b3eb8188d75ff2;
  local_168._56_8_ = 0xa36ec6ef2259fc71;
  local_168._32_8_ = 0x93b33db19c2b5897;
  local_168._40_8_ = 0x5aaf82a92bb30537;
  local_168._16_8_ = (void *)0xb651dd87a1c1ec65;
  local_168._24_8_ = 0xecd53796dc1eda4f;
  local_168._0_8_ = (void *)0xf146e2579750b07e;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xb91c615156884994;
  pubkey_00 = (code *)local_228;
  keypair_00 = (secp256k1_context *)local_398;
  pubkey = (secp256k1_context *)local_338;
  pcStack_410 = (code *)0x14f4c0;
  test_schnorrsig_bip_vectors_check_signing
            ((uchar *)pubkey_00,(uchar *)keypair_00,local_288,(uchar *)pubkey,0x20,local_168);
  pcStack_410 = (code *)0x14f4d9;
  test_schnorrsig_bip_vectors_check_verify((uchar *)keypair_00,(uchar *)pubkey,0x20,local_168,1);
  local_228._16_8_ = (void *)0xaae28b6d7430fa7d;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xb9c72dd2295f9765;
  local_228._0_8_ = (void *)0x12e499bb09359cd6;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
  local_398._16_8_ = (secp256k1_context *)0x9b591ac87578f199;
  local_398._24_8_ = (secp256k1_context *)0x36769b989986c56;
  local_398._0_8_ = (secp256k1_context *)0xb283cc8ff6c3f34d;
  local_398._8_8_ = (secp256k1_context *)0x24a73104c9429d7e;
  local_168._48_8_ = 0x93f5804ec071cb60;
  local_168._56_8_ = 0xf4d70883d2070b06;
  local_168._32_8_ = 0xb303f68a54b1af76;
  local_168._40_8_ = 0x10ee7d20f8c945eb;
  local_168._16_8_ = (void *)0x28aaf51494eda089;
  local_168._24_8_ = 0x639c5f79d6960dad;
  local_168._0_8_ = (void *)0x0;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3f56ce783b000000;
  extraparams = (secp256k1_schnorrsig_extraparams *)local_228;
  pcStack_410 = (code *)0x14f55a;
  test_schnorrsig_bip_vectors_check_verify((uchar *)extraparams,local_398,0x20,local_168,1);
  local_228._16_8_ = (void *)0x8776b979ae9898eb;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x344a2d4aa0fae466;
  local_228._0_8_ = (void *)0x507767db4ceafdee;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
  pcStack_410 = (code *)0x14f58b;
  iVar147 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
  if (iVar147 != 0) goto LAB_00150a1e;
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0x5ebe66e143c6737a;
  local_168._56_8_ = 0xe253c51a4ba3afbe;
  local_168._32_8_ = 0x7c60a644479c23c;
  local_168._40_8_ = 0xefd92309e17a10cd;
  local_168._16_8_ = (void *)0x8ba168852f47f682;
  local_168._24_8_ = 0x56752960147a052f;
  local_168._0_8_ = (void *)0xa4ee5e75d57bf9ff;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xd3355235143a4520;
  pcStack_410 = (code *)0x14f617;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0x355754fe4c952a62;
  local_168._56_8_ = 0xbdb2cdfc3451eaaa;
  local_168._32_8_ = 0x89716edb3e0b8928;
  local_168._40_8_ = 0xf8e45c518b4430b6;
  local_168._16_8_ = (void *)0xf46f3fdf13b032b4;
  local_168._24_8_ = 0x5f51e1e033cb9ff9;
  local_168._0_8_ = (void *)0x1cc2db1e332ea61f;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xa70011abd2924739;
  pcStack_410 = (code *)0x14f69b;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0xcedc5003ec9d7e8;
  local_168._56_8_ = 0xa66d2e0c0dff3418;
  local_168._32_8_ = 0xfc2f9baab3641796;
  local_168._40_8_ = 0x26a287687b94efb6;
  local_168._16_8_ = (void *)0x96d9b2896097c174;
  local_168._24_8_ = 0x6977173e54e5a23d;
  local_168._0_8_ = (void *)0xea696ca83b5cff6c;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
  pcStack_410 = (code *)0x14f721;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0xdc94d5f07634b74f;
  local_168._56_8_ = 0x516018bd25645cb6;
  local_168._32_8_ = 0x239caf2883da3d12;
  local_168._40_8_ = 0xba23d1cfee1f4ca9;
  local_168._16_8_ = (void *)0x0;
  local_168._24_8_ = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  pcStack_410 = (code *)0x14f7a7;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0xf95467ac117fa8db;
  local_168._56_8_ = 0x97f17c83a1d58037;
  local_168._32_8_ = 0x6488e25aaffb1576;
  local_168._40_8_ = 0xb4adde4297093c01;
  local_168._16_8_ = (void *)0x0;
  local_168._24_8_ = 0x100000000000000;
  local_168._0_8_ = (void *)0x0;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  pcStack_410 = (code *)0x14f82d;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0x2fb382aea813d7d1;
  local_168._56_8_ = 0x9bd307c47f5f9da7;
  local_168._32_8_ = 0x3d064554c9be869;
  local_168._40_8_ = 0xd75d7897846b1049;
  local_168._16_8_ = (void *)0xc79b260f2ba84d56;
  local_168._24_8_ = 0x1dba290422f8740a;
  local_168._0_8_ = (void *)0x5a3957aeac8d294a;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xcb1dfddb5d79d015;
  pcStack_410 = (code *)0x14f8b3;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = 0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = 0x447370032e8a1913;
  local_168._48_8_ = 0x2fb382aea813d7d1;
  local_168._56_8_ = 0x9bd307c47f5f9da7;
  local_168._32_8_ = 0x3d064554c9be869;
  local_168._40_8_ = 0xd75d7897846b1049;
  local_168._16_8_ = (void *)0xffffffffffffffff;
  local_168._24_8_ = 0x2ffcfffffeffffff;
  local_168._0_8_ = (void *)0xffffffffffffffff;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
  keypair_00 = (secp256k1_context *)local_398;
  pubkey_00 = (code *)local_168;
  pcStack_410 = (code *)0x14f939;
  test_schnorrsig_bip_vectors_check_verify(local_228,(uchar *)keypair_00,0x20,(uchar *)pubkey_00,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x59a62b507b0f2443;
  local_228._0_8_ = (void *)0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_398._16_8_ = (secp256k1_context *)0xd0319f29223809a4;
  local_398._24_8_ = (secp256k1_context *)0x896c4eec98fa2e08;
  local_398._0_8_ = (secp256k1_context *)0xd308a385886a3f24;
  local_398._8_8_ = (secp256k1_context *)0x447370032e8a1913;
  local_168._48_8_ = 0x3ba048afe6dcaeba;
  local_168._56_8_ = 0x414136d08c5ed2bf;
  local_168._32_8_ = 0xffffffffffffffff;
  local_168._40_8_ = 0xfeffffffffffffff;
  local_168._16_8_ = (void *)0x96d9b2896097c174;
  local_168._24_8_ = 0x6977173e54e5a23d;
  local_168._0_8_ = (void *)0xea696ca83b5cff6c;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
  extraparams = (secp256k1_schnorrsig_extraparams *)local_228;
  pcStack_410 = (code *)0x14f9b9;
  test_schnorrsig_bip_vectors_check_verify((uchar *)extraparams,local_398,0x20,local_168,0);
  local_228._16_8_ = (void *)0xffffffffffffffff;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x30fcfffffeffffff;
  local_228._0_8_ = (void *)0xffffffffffffffff;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
  pcStack_410 = (code *)0x14f9ea;
  iVar147 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
  if (iVar147 != 0) goto LAB_00150a23;
  local_228._16_8_ = (void *)0x4003400340034003;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x4003400340034003;
  local_228._0_8_ = (void *)0x4003400340034003;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
  local_398._16_8_ = 0x238be6f6b6faf94b;
  local_398._24_8_ = 0x17d16f4d32976408;
  local_398._0_8_ = 0xc43a39b453aa8c77;
  local_398._8_8_ = 0x22877a49094d7767;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_168._48_8_ = 0x272865ac0f562d9f;
  local_168._56_8_ = 0x63ab27e47405afd1;
  local_168._32_8_ = 0x624603bf26ce6960;
  local_168._40_8_ = 0x648adb623a9af128;
  local_168._16_8_ = (void *)0xccfc326743adb66b;
  local_168._24_8_ = 0xcf645489551a2925;
  local_168._0_8_ = (void *)0xfbd9ec65b15d5371;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x1861eafa5f6e04bc;
  local_2b8._40_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  pcStack_410 = (code *)0x14fa9a;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_398,local_288,(uchar *)0x0,0,local_168);
  pcStack_410 = (code *)0x14faaf;
  test_schnorrsig_bip_vectors_check_verify(local_398,(uchar *)0x0,0,local_168,1);
  local_228._16_8_ = (void *)0x4003400340034003;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x4003400340034003;
  local_228._0_8_ = (void *)0x4003400340034003;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
  local_398._16_8_ = 0x238be6f6b6faf94b;
  local_398._24_8_ = 0x17d16f4d32976408;
  local_398._0_8_ = 0xc43a39b453aa8c77;
  local_398._8_8_ = 0x22877a49094d7767;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
  local_338[0] = 0x11;
  local_168._48_8_ = 0x337d575afcac7cfe;
  local_168._56_8_ = 0xbfac2bec4c5614ec;
  local_168._32_8_ = 0xbd8366eabf7331ea;
  local_168._40_8_ = 0x9619bc5daaa51f10;
  local_168._16_8_ = (void *)0x354c3be64a93b9b1;
  local_168._24_8_ = 0x3a3c63411aef311;
  local_168._0_8_ = (void *)0x2441f6fe0a0aa208;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3a583c69e0329264;
  pcStack_410 = (code *)0x14fb5d;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_398,local_288,local_338,1,local_168);
  pcStack_410 = (code *)0x14fb76;
  test_schnorrsig_bip_vectors_check_verify(local_398,local_338,1,local_168,1);
  local_228._16_8_ = (void *)0x4003400340034003;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0x4003400340034003;
  local_228._0_8_ = (void *)0x4003400340034003;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
  local_398._16_8_ = 0x238be6f6b6faf94b;
  local_398._24_8_ = 0x17d16f4d32976408;
  local_398._0_8_ = 0xc43a39b453aa8c77;
  local_398._8_8_ = 0x22877a49094d7767;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_338[0x10] = 0x11;
  local_338._0_8_ = 0x807060504030201;
  local_338._8_8_ = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
  local_168._48_8_ = 0x515a0ed87fa3e5e1;
  local_168._56_8_ = 0xa5a57ea966557c89;
  local_168._32_8_ = 0xf860f97bb782a4c4;
  local_168._40_8_ = 0xec71675be2401568;
  local_168._16_8_ = (void *)0x523c1ea7d199865d;
  local_168._24_8_ = 0x70c30ab5b6fd9ada;
  local_168._0_8_ = (void *)0x3bb459409af33051;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x2be5ec199ac0cac7;
  keypair_00 = (secp256k1_context *)local_228;
  pubkey_00 = (code *)local_398;
  pcStack_410 = (code *)0x14fc2f;
  test_schnorrsig_bip_vectors_check_signing
            ((uchar *)keypair_00,(uchar *)pubkey_00,local_288,local_338,0x11,local_168);
  pcStack_410 = (code *)0x14fc48;
  test_schnorrsig_bip_vectors_check_verify((uchar *)pubkey_00,local_338,0x11,local_168,1);
  local_398._16_8_ = (secp256k1_context *)0x4003400340034003;
  local_398._24_8_ = (secp256k1_context *)0x4003400340034003;
  local_398._0_8_ = (secp256k1_context *)0x4003400340034003;
  local_398._8_8_ = (secp256k1_context *)0x4003400340034003;
  local_278._8_8_ = 0x17d16f4d32976408;
  local_278._0_8_ = 0x238be6f6b6faf94b;
  local_288._8_8_ = 0x22877a49094d7767;
  local_288._0_8_ = 0xc43a39b453aa8c77;
  local_338._16_8_ = (void *)0x0;
  local_338._24_8_ = 0;
  local_338._0_8_ = 0;
  local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  local_1f8 = (void *)0xa0b4d0e9a0cb7f89;
  uStack_1f0 = 0x6723f249d2cf9468;
  local_228._32_8_ = (void *)0xe7070817e3d35e58;
  p_Stack_200 = (_func_void_char_ptr_void_ptr *)0x237b4cc50f723bc0;
  local_228._16_8_ = (void *)0x6fbea8bf5d1e3203;
  local_228._24_8_ = (_func_void_char_ptr_void_ptr *)0xa879ca3e16351609;
  local_228._0_8_ = (void *)0x345a55d8b0123b40;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
  local_168._80_8_ = 0x9999999999999999;
  local_168._88_8_ = 0x9999999999999999;
  local_168._64_8_ = 0x9999999999999999;
  local_168._72_8_ = 0x9999999999999999;
  local_168._48_8_ = 0x9999999999999999;
  local_168._56_8_ = 0x9999999999999999;
  local_168._32_8_ = 0x9999999999999999;
  local_168._40_8_ = 0x9999999999999999;
  local_168._16_8_ = (void *)0x9999999999999999;
  local_168._24_8_ = 0x9999999999999999;
  local_168._0_8_ = (void *)0x9999999999999999;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x9999999999999999;
  local_168._96_4_ = 0x99999999;
  pcStack_410 = (code *)0x14fd19;
  test_schnorrsig_bip_vectors_check_signing(local_398,local_288,local_338,local_168,100,local_228);
  pcStack_410 = (code *)0x14fd32;
  test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,local_228,1);
  if (0 < COUNT) {
    keypair_00 = (secp256k1_context *)local_288;
    do {
      psVar181 = (secp256k1_context *)local_168;
      pubkey = (secp256k1_context *)local_228;
      extraparams = (secp256k1_schnorrsig_extraparams *)local_2b8;
      unaff_RBP = nonce_function_bip340;
      local_2e8 = (void *)0x6e68637320612072;
      p_Stack_2e0 = (_func_void_char_ptr_void_ptr *)0x2e2e67697372726f;
      local_338._64_8_ = (void *)0x2073692073696874;
      p_Stack_2f0 = (_func_void_char_ptr_void_ptr *)0x6f662067736d2061;
      local_338._48_8_ = (void *)0x0;
      local_338._56_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_338._32_8_ = 0;
      local_338._40_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_338._16_8_ = (void *)0x0;
      local_338._24_8_ = 0;
      local_338._0_8_ = 0;
      local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = local_3c8._8_8_;
      local_3c8 = auVar132 << 0x40;
      local_3d8 = ZEXT816(0x8cb36fda);
      pcStack_410 = (code *)0x14fdb9;
      testrand256((uchar *)extraparams);
      pcStack_410 = (code *)0x14fdc6;
      testrand256(local_2d8);
      pcStack_410 = (code *)0x14fdd8;
      iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar181,(uchar *)extraparams);
      if (iVar147 == 0) goto LAB_00150857;
      pcStack_410 = (code *)0x14fdf4;
      iVar147 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                           (secp256k1_keypair *)psVar181);
      r = (code *)psVar181;
      if (iVar147 == 0) goto LAB_0015085c;
      pubkey_00 = (code *)local_398;
      r = (code *)(local_338 + 0x40);
      pcStack_410 = (code *)0x14fe2e;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar181,
                           nonce_function_bip340,(void *)0x0);
      if (iVar147 == 0) goto LAB_00150861;
      pcStack_410 = (code *)0x14fe50;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar147 == 0) goto LAB_00150866;
      pcStack_410 = (code *)0x14fe82;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair_00,(uchar *)r,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar147 == 0) goto LAB_0015086b;
      lVar152 = 0;
      extraparams = (secp256k1_schnorrsig_extraparams *)local_3d8;
      do {
        psVar181 = (secp256k1_context *)r;
        if (local_398[lVar152] != local_288[lVar152]) goto LAB_00150a64;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 0x40);
      pubkey_00 = (code *)local_398;
      pcStack_410 = (code *)0x14fed2;
      iVar147 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)local_168,
                           extraparams);
      if (iVar147 == 0) goto LAB_00150870;
      pcStack_410 = (code *)0x14fef4;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar147 == 0) goto LAB_00150875;
      uStack_360 = 0x101010101010101;
      local_398._48_8_ = 0x101010101010101;
      local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398._40_8_ = 0x101010101010101;
      local_398._16_8_ = (secp256k1_context *)0x101010101010101;
      local_398._24_8_ = (secp256k1_context *)0x101010101010101;
      local_398._0_8_ = (secp256k1_context *)0x101010101010101;
      local_398._8_8_ = (secp256k1_context *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_failing;
      pcStack_410 = (code *)0x14ff53;
      iVar147 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)local_168,
                           extraparams);
      if (iVar147 != 0) goto LAB_0015087a;
      lVar152 = 0;
      psVar181 = (secp256k1_context *)local_168;
      do {
        if (local_398[lVar152] != local_338[lVar152]) goto LAB_00150a69;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 0x40);
      uStack_360 = 0x101010101010101;
      local_398._48_8_ = 0x101010101010101;
      local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398._40_8_ = 0x101010101010101;
      local_398._16_8_ = (secp256k1_context *)0x101010101010101;
      local_398._24_8_ = (secp256k1_context *)0x101010101010101;
      local_398._0_8_ = (secp256k1_context *)0x101010101010101;
      local_398._8_8_ = (secp256k1_context *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_0;
      pcStack_410 = (code *)0x14ffd6;
      iVar147 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)r,0x20,(secp256k1_keypair *)psVar181,extraparams);
      pubkey_00 = r;
      if (iVar147 != 0) goto LAB_0015087f;
      lVar152 = 0;
      do {
        psVar166 = extraparams;
        if (local_398[lVar152] != local_338[lVar152]) goto LAB_00150a6e;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 0x40);
      uStack_360 = 0x101010101010101;
      local_398._48_8_ = 0x101010101010101;
      local_398._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398._40_8_ = 0x101010101010101;
      local_398._16_8_ = (secp256k1_context *)0x101010101010101;
      local_398._24_8_ = (secp256k1_context *)0x101010101010101;
      local_398._0_8_ = (secp256k1_context *)0x101010101010101;
      local_398._8_8_ = (secp256k1_context *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_overflowing;
      pubkey_00 = (code *)local_398;
      pcStack_410 = (code *)0x150054;
      iVar147 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar181,
                           extraparams);
      if (iVar147 == 0) goto LAB_00150884;
      pcStack_410 = (code *)0x150076;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar147 == 0) goto LAB_00150889;
      local_3d8._8_8_ = 0;
      local_3c8._0_8_ = local_2d8;
      psVar166 = (secp256k1_schnorrsig_extraparams *)local_168;
      pcStack_410 = (code *)0x1500b9;
      iVar147 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar166,
                           extraparams);
      if (iVar147 == 0) goto LAB_0015088e;
      pcStack_410 = (code *)0x1500ea;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar166,
                           nonce_function_bip340,(void *)local_3c8._0_8_);
      pubkey_00 = (code *)keypair_00;
      if (iVar147 == 0) goto LAB_00150893;
      lVar152 = 0;
      psVar166 = (secp256k1_schnorrsig_extraparams *)local_338;
      do {
        if (local_398[lVar152] != local_288[lVar152]) goto LAB_00150a73;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 0x40);
      r = (code *)local_2b8;
      pcStack_410 = (code *)0x150126;
      testrand256((uchar *)r);
      pcStack_410 = (code *)0x150138;
      iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair_00,(uchar *)r);
      if (iVar147 == 0) goto LAB_00150898;
      pcStack_410 = (code *)0x150154;
      iVar147 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)psVar166,(int *)0x0,
                           (secp256k1_keypair *)keypair_00);
      if (iVar147 == 0) goto LAB_0015089d;
      psVar181 = (secp256k1_context *)0x0;
      pubkey_00 = (code *)pubkey;
      do {
        pubkey = (secp256k1_context *)(local_398 + (long)psVar181);
        pcStack_410 = (code *)0x150172;
        testrand256((uchar *)pubkey);
        pcStack_410 = (code *)0x150197;
        iVar147 = secp256k1_schnorrsig_sign_internal
                            (CTX,(uchar *)pubkey_00,(uchar *)pubkey,0x20,
                             (secp256k1_keypair *)keypair_00,nonce_function_bip340,(void *)0x0);
        if (iVar147 == 0) {
          pcStack_410 = (code *)0x150848;
          run_schnorrsig_tests_cold_66();
LAB_00150848:
          pcStack_410 = (code *)0x15084d;
          run_schnorrsig_tests_cold_65();
          goto LAB_0015084d;
        }
        pcStack_410 = (code *)0x1501b9;
        iVar147 = secp256k1_schnorrsig_verify
                            (CTX,(uchar *)pubkey_00,(uchar *)pubkey,0x20,
                             (secp256k1_xonly_pubkey *)psVar166);
        if (iVar147 == 0) goto LAB_00150848;
        psVar181 = (secp256k1_context *)((psVar181->ecmult_gen_ctx).scalar_offset.d + 3);
        pubkey_00 = (code *)((((secp256k1_context *)pubkey_00)->ecmult_gen_ctx).ge_offset.x.n + 3);
      } while (psVar181 != (secp256k1_context *)0x60);
      pcStack_410 = (code *)0x1501d9;
      uVar148 = testrand_int(3);
      uVar170 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar154 = secp256k1_test_state[1] << 0x11;
      uVar163 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar169 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar163;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar169;
      secp256k1_test_state[2] = uVar163 ^ uVar154;
      secp256k1_test_state[3] = uVar169 << 0x2d | uVar169 >> 0x13;
      r = (code *)(uVar170 >> 0x3b);
      pcStack_410 = (code *)0x150246;
      uVar149 = testrand_int(0xfe);
      pubkey = (secp256k1_context *)(local_228 + (ulong)uVar148 * 0x40);
      bVar186 = (char)uVar149 + 1;
      pubkey_00 = (code *)(ulong)CONCAT31((int3)(uVar149 >> 8),bVar186);
      puVar156 = (uchar *)((long)(((secp256k1_context *)r)->ecmult_gen_ctx).scalar_offset.d +
                          (long)((long)(&(pubkey->ecmult_gen_ctx).scalar_offset + -1) + 0x10));
      *puVar156 = *puVar156 ^ bVar186;
      unaff_RBP = (code *)(local_398 + (ulong)uVar148 * 0x20);
      pcStack_410 = (code *)0x150288;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 != 0) goto LAB_001508a2;
      puVar156 = (uchar *)((long)(((secp256k1_context *)r)->ecmult_gen_ctx).scalar_offset.d +
                          (long)((long)(&(pubkey->ecmult_gen_ctx).scalar_offset + -1) + 0x10));
      *puVar156 = *puVar156 ^ bVar186;
      uVar170 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar154 = secp256k1_test_state[1] << 0x11;
      uVar163 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar169 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar163;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar169;
      secp256k1_test_state[2] = uVar163 ^ uVar154;
      secp256k1_test_state[3] = uVar169 << 0x2d | uVar169 >> 0x13;
      r = (code *)(uVar170 >> 0x3b);
      puVar156 = (uchar *)((long)((((secp256k1_context *)r)->ecmult_gen_ctx).scalar_offset.d + 3) +
                          (long)pubkey);
      *puVar156 = *puVar156 ^ bVar186;
      pcStack_410 = (code *)0x150317;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 != 0) goto LAB_001508a7;
      pbVar1 = (byte *)((long)(pubkey->ecmult_gen_ctx).scalar_offset.d +
                       (long)(&(((secp256k1_context *)r)->ecmult_gen_ctx).scalar_offset + -1) + 0x30
                       );
      *pbVar1 = *pbVar1 ^ bVar186;
      uVar170 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar154 = secp256k1_test_state[1] << 0x11;
      uVar163 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar169 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar163;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar169;
      secp256k1_test_state[2] = uVar163 ^ uVar154;
      secp256k1_test_state[3] = uVar169 << 0x2d | uVar169 >> 0x13;
      r = (code *)(uVar170 >> 0x3b);
      unaff_RBP[(long)&((secp256k1_context *)r)->ecmult_gen_ctx] =
           (code)((byte)unaff_RBP[(long)&((secp256k1_context *)r)->ecmult_gen_ctx] ^ bVar186);
      pcStack_410 = (code *)0x1503aa;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 != 0) goto LAB_001508ac;
      r = unaff_RBP + (long)&((secp256k1_context *)r)->ecmult_gen_ctx;
      *(byte *)&(((secp256k1_context *)r)->ecmult_gen_ctx).built =
           (byte)(((secp256k1_context *)r)->ecmult_gen_ctx).built ^ bVar186;
      pcStack_410 = (code *)0x1503d3;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 == 0) goto LAB_001508b1;
      pubkey = (secp256k1_context *)local_228;
      unaff_RBP = (code *)local_398;
      r = nonce_function_bip340;
      pcStack_410 = (code *)0x150414;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_keypair *)keypair_00,nonce_function_bip340,(void *)0x0);
      if (iVar147 == 0) goto LAB_001508b6;
      pcStack_410 = (code *)0x150436;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 == 0) goto LAB_001508bb;
      pubkey_00 = (code *)(local_228 + 0x20);
      local_1f8 = (void *)0xffffffffffffffff;
      uStack_1f0 = 0xffffffffffffffff;
      local_228._32_8_ = (void *)0xffffffffffffffff;
      p_Stack_200 = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
      pcStack_410 = (code *)0x15046f;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 != 0) goto LAB_001508c0;
      pcStack_410 = (code *)0x15049c;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_keypair *)keypair_00,nonce_function_bip340,(void *)0x0);
      if (iVar147 == 0) goto LAB_001508c5;
      pcStack_410 = (code *)0x1504be;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 == 0) goto LAB_001508ca;
      r = (code *)(local_338 + 0x40);
      pcStack_410 = (code *)0x1504db;
      secp256k1_scalar_set_b32((secp256k1_scalar *)r,(uchar *)pubkey_00,(int *)0x0);
      pcStack_410 = (code *)0x1504e6;
      secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
      pcStack_410 = (code *)0x1504f1;
      secp256k1_scalar_get_b32((uchar *)pubkey_00,(secp256k1_scalar *)r);
      pcStack_410 = (code *)0x15050b;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar166);
      psVar174 = keypair_00;
      if (iVar147 != 0) goto LAB_001508cf;
      pcStack_410 = (code *)0x150537;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_keypair *)keypair_00,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar147 == 0) goto LAB_001508d4;
      pcStack_410 = (code *)0x150555;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar166);
      if (iVar147 == 0) goto LAB_001508d9;
      pcStack_410 = (code *)0x150567;
      uVar148 = testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar148;
      uVar169 = 0xffffffffffffffe0;
      psVar166 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        pcStack_410 = (code *)0x150585;
        testrand256(local_168 + uVar169 + 0x20);
        uVar169 = uVar169 + 0x20;
      } while (uVar169 < 0xe0);
      psVar181 = (secp256k1_context *)(ulong)uVar148;
      pcStack_410 = (code *)0x1505b8;
      iVar147 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)psVar166,(size_t)psVar181,
                           (secp256k1_keypair *)keypair_00,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      pubkey_00 = (code *)psVar181;
      if (iVar147 == 0) goto LAB_001508de;
      pubkey_00 = (code *)local_338;
      pcStack_410 = (code *)0x1505e0;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar166,(size_t)psVar181,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar147 == 0) goto LAB_001508e3;
      unaff_RBP = (code *)(ulong)(uVar148 - 1);
      pcStack_410 = (code *)0x150603;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar166,(ulong)unaff_RBP & 0xff,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar147 != 0) goto LAB_001508e8;
      uVar165 = (int)local_2b8._40_8_ + 1;
      local_2b8._40_8_ = ZEXT48(uVar165);
      unaff_RBP = nonce_function_bip340;
    } while ((int)uVar165 < COUNT);
  }
  psVar181 = (secp256k1_context *)local_168;
  pubkey = (secp256k1_context *)local_228;
  extraparams = (secp256k1_schnorrsig_extraparams *)local_338;
  pcStack_410 = (code *)0x150650;
  testrand256((uchar *)extraparams);
  pcStack_410 = (code *)0x150667;
  iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)extraparams);
  if (iVar147 == 0) goto LAB_00150a28;
  pcStack_410 = (code *)0x15068d;
  iVar147 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                       (secp256k1_keypair *)local_168);
  if (iVar147 == 0) goto LAB_00150a2d;
  pcStack_410 = (code *)0x1506b1;
  iVar147 = secp256k1_xonly_pubkey_serialize(CTX,local_2d8,(secp256k1_xonly_pubkey *)local_228);
  if (iVar147 == 0) goto LAB_00150a32;
  pcStack_410 = (code *)0x1506d5;
  iVar147 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)local_168,local_2d8);
  if (iVar147 != 1) goto LAB_00150a37;
  pcStack_410 = (code *)0x1506fc;
  iVar147 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_398,(int *)local_3b8,
                       (secp256k1_keypair *)local_168);
  if (iVar147 == 0) goto LAB_00150a3c;
  pcStack_410 = (code *)0x15071d;
  iVar147 = secp256k1_xonly_pubkey_serialize
                      (CTX,local_338 + 0x40,(secp256k1_xonly_pubkey *)local_398);
  if (iVar147 == 0) goto LAB_00150a41;
  extraparams = (secp256k1_schnorrsig_extraparams *)local_3d8;
  pcStack_410 = (code *)0x150732;
  testrand256((uchar *)extraparams);
  pcStack_410 = (code *)0x150765;
  iVar147 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_288,(uchar *)extraparams,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  if (iVar147 == 0) goto LAB_00150a46;
  pcStack_410 = (code *)0x150786;
  iVar147 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_398,local_338 + 0x40);
  if (iVar147 == 0) goto LAB_00150a4b;
  pcStack_410 = (code *)0x1507b1;
  iVar147 = secp256k1_schnorrsig_verify
                      (CTX,local_288,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_398);
  if (iVar147 == 0) goto LAB_00150a50;
  pcStack_410 = (code *)0x1507d5;
  iVar147 = secp256k1_xonly_pubkey_serialize(CTX,local_2b8,(secp256k1_xonly_pubkey *)local_228);
  if (iVar147 == 0) goto LAB_00150a55;
  pcStack_410 = (code *)0x1507f9;
  iVar147 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_228,local_2b8);
  if (iVar147 == 0) goto LAB_00150a5a;
  pcStack_410 = (code *)0x150829;
  iVar147 = secp256k1_xonly_pubkey_tweak_add_check
                      (CTX,local_338 + 0x40,local_3b8._0_4_,(secp256k1_xonly_pubkey *)local_228,
                       local_2d8);
  if (iVar147 != 0) {
    return;
  }
  goto LAB_00150a5f;
code_r0x00150bc1:
  pmStackY_df8 = (musig_sign_verify_vector *)0x150bd1;
  testrand256(auStack_4c0 + 0x40);
  pmStackY_df8 = (musig_sign_verify_vector *)0x150c01;
  pmVar175 = (musig_sign_verify_vector *)CTX;
  iVar147 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)auStack_700,
                       (secp256k1_musig_pubnonce *)pubnonce,auStack_4c0 + 0x40,pmVar185->sk,
                       (secp256k1_pubkey *)keyagg_cache,(uchar *)0x0,
                       (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
  bVar161 = false;
  plVar176 = (long *)(auStack_be0 + 8);
  sha2 = (musig_tweak_vector *)(asStack_da0 + 1);
  pmVar179 = (musig_key_agg_vector *)(auStack_bd0 + 8);
  keyagg_cache = (musig_sign_verify_vector *)(auStack_bb0 + 0x40);
  keyagg_cache_00 = (musig_nonce_agg_vector *)(auStack_bc0 + 8);
  pmVar167 = (musig_sign_verify_vector *)auStack_a00;
  pmVar185 = (musig_sign_verify_vector *)(aiStack_d40 + 8);
  pubnonce = nonce_01;
  psVar162 = (secp256k1_musig_secnonce *)(auStack_700 + 0x84);
  if (iVar147 != 1) {
LAB_0015287c:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152881;
    run_musig_tests_cold_97();
    goto LAB_00152881;
  }
  goto LAB_00150b20;
LAB_00152881:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152886;
  run_musig_tests_cold_92();
LAB_00152886:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15288b;
  run_musig_tests_cold_1();
LAB_0015288b:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152890;
  run_musig_tests_cold_4();
  cache_i = keyagg_cache;
  nonce_01 = pmVar185;
LAB_00152890:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152895;
  run_musig_tests_cold_5();
LAB_00152895:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15289a;
  run_musig_tests_cold_81();
LAB_0015289a:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15289f;
  run_musig_tests_cold_21();
  pmVar167 = (musig_sign_verify_vector *)sha2;
  keyagg_cache = (musig_sign_verify_vector *)pmVar179;
  pmVar185 = nonce_01;
LAB_0015289f:
  sha2 = (musig_tweak_vector *)pmVar167;
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528a4;
  run_musig_tests_cold_90();
LAB_001528a4:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528a9;
  run_musig_tests_cold_86();
LAB_001528a9:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528ae;
  run_musig_tests_cold_87();
  nonce_01 = pmVar185;
LAB_001528ae:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528b3;
  run_musig_tests_cold_85();
LAB_001528b3:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528b8;
  run_musig_tests_cold_69();
  pmVar168 = (musig_sig_agg_vector *)sha2;
  pmVar185 = nonce_01;
LAB_001528b8:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528bd;
  run_musig_tests_cold_6();
LAB_001528bd:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528c2;
  run_musig_tests_cold_8();
  puVar156 = pubnonce->sk;
  pmVar167 = cache_i;
LAB_001528c2:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528c7;
  run_musig_tests_cold_7();
LAB_001528c7:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528cc;
  run_musig_tests_cold_42();
  sha2 = (musig_tweak_vector *)pmVar168;
  pubnonce = (musig_sign_verify_vector *)puVar156;
  pmVar179 = (musig_key_agg_vector *)keyagg_cache;
  keyagg_cache = pmVar167;
  nonce_01 = pmVar185;
LAB_001528cc:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528d1;
  run_musig_tests_cold_3();
LAB_001528d1:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528d6;
  run_musig_tests_cold_84();
  pmVar167 = (musig_sign_verify_vector *)pmVar179;
  pmVar185 = nonce_01;
LAB_001528d6:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528db;
  run_musig_tests_cold_96();
LAB_001528db:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528e0;
  run_musig_tests_cold_95();
LAB_001528e0:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528e5;
  run_musig_tests_cold_94();
  pmVar179 = (musig_key_agg_vector *)pmVar167;
LAB_001528e5:
  nonce_01 = pmVar185;
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528ea;
  run_musig_tests_cold_93();
LAB_001528ea:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528ef;
  run_musig_tests_cold_11();
LAB_001528ef:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528f4;
  run_musig_tests_cold_12();
LAB_001528f4:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528f9;
  run_musig_tests_cold_2();
LAB_001528f9:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1528fe;
  run_musig_tests_cold_91();
LAB_001528fe:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152903;
  run_musig_tests_cold_83();
LAB_00152903:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152908;
  run_musig_tests_cold_15();
LAB_00152908:
  pmVar182 = keyagg_cache;
  pmStackY_df8 = (musig_sign_verify_vector *)0x15290d;
  run_musig_tests_cold_82();
LAB_0015290d:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152912;
  run_musig_tests_cold_80();
LAB_00152912:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152917;
  run_musig_tests_cold_79();
  cache_i = pmVar182;
LAB_00152917:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15291c;
  run_musig_tests_cold_14();
LAB_0015291c:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152921;
  run_musig_tests_cold_13();
  pmVar185 = nonce_01;
LAB_00152921:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152926;
  run_musig_tests_cold_9();
  keyagg_cache = (musig_sign_verify_vector *)pmVar179;
LAB_00152926:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15292b;
  run_musig_tests_cold_89();
  pmVar179 = (musig_key_agg_vector *)keyagg_cache;
  nonce_01 = pmVar185;
LAB_0015292b:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152930;
  run_musig_tests_cold_88();
  pmVar167 = pubnonce;
LAB_00152930:
  pubnonce = pmVar167;
  pmStackY_df8 = (musig_sign_verify_vector *)0x152935;
  run_musig_tests_cold_78();
  pmVar167 = cache_i;
  pmVar185 = (musig_sign_verify_vector *)keyagg_cache_00;
LAB_00152935:
  cache_i = nonce_01;
  keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
  pmStackY_df8 = (musig_sign_verify_vector *)0x15293a;
  run_musig_tests_cold_77();
LAB_0015293a:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15293f;
  run_musig_tests_cold_76();
  puVar156 = pubnonce->sk;
  pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
  keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar185;
LAB_0015293f:
  pubnonce = (musig_sign_verify_vector *)sha2;
  pmStackY_df8 = (musig_sign_verify_vector *)0x152944;
  run_musig_tests_cold_75();
LAB_00152944:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152949;
  run_musig_tests_cold_74();
  nonce_01 = cache_i;
LAB_00152949:
  cache_i = pmVar167;
  pmStackY_df8 = (musig_sign_verify_vector *)0x15294e;
  run_musig_tests_cold_73();
LAB_0015294e:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152953;
  run_musig_tests_cold_72();
  sha2 = (musig_tweak_vector *)pubnonce;
  keyagg_cache = (musig_sign_verify_vector *)pmVar179;
LAB_00152953:
  pubnonce = (musig_sign_verify_vector *)puVar156;
  pmStackY_df8 = (musig_sign_verify_vector *)0x152958;
  run_musig_tests_cold_71();
LAB_00152958:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15295d;
  run_musig_tests_cold_70();
LAB_0015295d:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152962;
  run_musig_tests_cold_24();
LAB_00152962:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152967;
  run_musig_tests_cold_68();
  pmVar167 = pubnonce;
LAB_00152967:
  pubnonce = (musig_sign_verify_vector *)sha2;
  pmStackY_df8 = (musig_sign_verify_vector *)0x15296c;
  run_musig_tests_cold_67();
LAB_0015296c:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152971;
  run_musig_tests_cold_66();
  sha2 = (musig_tweak_vector *)pubnonce;
  pubnonce = pmVar167;
LAB_00152971:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152976;
  run_musig_tests_cold_65();
  pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
LAB_00152976:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15297b;
  run_musig_tests_cold_33();
  puVar156 = pubnonce->sk;
LAB_0015297b:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152980;
  run_musig_tests_cold_35();
LAB_00152980:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152985;
  run_musig_tests_cold_62();
  pmVar179 = (musig_key_agg_vector *)keyagg_cache;
LAB_00152985:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15298a;
  run_musig_tests_cold_61();
LAB_0015298a:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15298f;
  run_musig_tests_cold_60();
LAB_0015298f:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152994;
  run_musig_tests_cold_59();
  keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
LAB_00152994:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152999;
  run_musig_tests_cold_58();
LAB_00152999:
  pmStackY_df8 = (musig_sign_verify_vector *)0x15299e;
  run_musig_tests_cold_57();
  keyagg_cache = (musig_sign_verify_vector *)pmVar179;
LAB_0015299e:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529a3;
  run_musig_tests_cold_26();
  pmVar167 = cache_i;
LAB_001529a3:
  pmVar168 = (musig_sig_agg_vector *)sha2;
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529a8;
  run_musig_tests_cold_56();
LAB_001529a8:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529ad;
  run_musig_tests_cold_55();
LAB_001529ad:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529b2;
  run_musig_tests_cold_54();
  pmVar185 = nonce_01;
LAB_001529b2:
  nonce_01 = pmVar185;
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529b7;
  run_musig_tests_cold_43();
LAB_001529b7:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529bc;
  run_musig_tests_cold_53();
LAB_001529bc:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529c1;
  run_musig_tests_cold_52();
LAB_001529c1:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529c6;
  run_musig_tests_cold_51();
  pubnonce = (musig_sign_verify_vector *)puVar156;
  cache_i = pmVar167;
LAB_001529c6:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529cb;
  run_musig_tests_cold_37();
LAB_001529cb:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529d0;
  run_musig_tests_cold_34();
  pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
LAB_001529d0:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529d5;
  run_musig_tests_cold_25();
LAB_001529d5:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529da;
  run_musig_tests_cold_36();
  keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
LAB_001529da:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529df;
  run_musig_tests_cold_32();
LAB_001529df:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529e4;
  run_musig_tests_cold_31();
  sha2 = (musig_tweak_vector *)pmVar168;
  pmVar179 = (musig_key_agg_vector *)keyagg_cache;
  keyagg_cache = cache_i;
LAB_001529e4:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529e9;
  run_musig_tests_cold_10();
LAB_001529e9:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529ee;
  run_musig_tests_cold_16();
LAB_001529ee:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529f3;
  run_musig_tests_cold_17();
LAB_001529f3:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529f8;
  run_musig_tests_cold_18();
LAB_001529f8:
  pmStackY_df8 = (musig_sign_verify_vector *)0x1529fd;
  run_musig_tests_cold_19();
LAB_001529fd:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a02;
  run_musig_tests_cold_20();
LAB_00152a02:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a07;
  run_musig_tests_cold_30();
LAB_00152a07:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a0c;
  run_musig_tests_cold_27();
LAB_00152a0c:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a11;
  run_musig_tests_cold_28();
LAB_00152a11:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a16;
  run_musig_tests_cold_29();
  puVar156 = pubnonce->sk;
  cache_i = keyagg_cache;
LAB_00152a16:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a1b;
  run_musig_tests_cold_22();
  pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
LAB_00152a1b:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a20;
  run_musig_tests_cold_23();
LAB_00152a20:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a25;
  run_musig_tests_cold_38();
  pmVar168 = (musig_sig_agg_vector *)sha2;
  keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
LAB_00152a25:
  keyagg_cache = (musig_sign_verify_vector *)pmVar179;
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a2a;
  run_musig_tests_cold_39();
LAB_00152a2a:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a2f;
  run_musig_tests_cold_44();
  pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
  goto LAB_00152a2f;
LAB_0015084d:
  pcStack_410 = (code *)0x150852;
  run_schnorrsig_tests_cold_112();
  extraparams = psVar166;
LAB_00150852:
  pcStack_410 = (code *)0x150857;
  run_schnorrsig_tests_cold_110();
LAB_00150857:
  pcStack_410 = (code *)0x15085c;
  run_schnorrsig_tests_cold_79();
  r = (code *)psVar181;
LAB_0015085c:
  pcStack_410 = (code *)0x150861;
  run_schnorrsig_tests_cold_78();
LAB_00150861:
  pcStack_410 = (code *)0x150866;
  run_schnorrsig_tests_cold_77();
LAB_00150866:
  pcStack_410 = (code *)0x15086b;
  run_schnorrsig_tests_cold_76();
LAB_0015086b:
  pcStack_410 = (code *)0x150870;
  run_schnorrsig_tests_cold_75();
LAB_00150870:
  pcStack_410 = (code *)0x150875;
  run_schnorrsig_tests_cold_74();
LAB_00150875:
  pcStack_410 = (code *)0x15087a;
  run_schnorrsig_tests_cold_73();
LAB_0015087a:
  pcStack_410 = (code *)0x15087f;
  run_schnorrsig_tests_cold_33();
  psVar181 = (secp256k1_context *)r;
LAB_0015087f:
  r = (code *)psVar181;
  pcStack_410 = (code *)0x150884;
  run_schnorrsig_tests_cold_35();
LAB_00150884:
  pcStack_410 = (code *)0x150889;
  run_schnorrsig_tests_cold_72();
  psVar166 = extraparams;
LAB_00150889:
  pcStack_410 = (code *)0x15088e;
  run_schnorrsig_tests_cold_71();
LAB_0015088e:
  pcStack_410 = (code *)0x150893;
  run_schnorrsig_tests_cold_70();
LAB_00150893:
  pcStack_410 = (code *)0x150898;
  run_schnorrsig_tests_cold_69();
LAB_00150898:
  pcStack_410 = (code *)0x15089d;
  run_schnorrsig_tests_cold_68();
LAB_0015089d:
  pcStack_410 = (code *)0x1508a2;
  run_schnorrsig_tests_cold_67();
LAB_001508a2:
  pcStack_410 = (code *)0x1508a7;
  run_schnorrsig_tests_cold_38();
LAB_001508a7:
  pcStack_410 = (code *)0x1508ac;
  run_schnorrsig_tests_cold_39();
LAB_001508ac:
  pcStack_410 = (code *)0x1508b1;
  run_schnorrsig_tests_cold_40();
LAB_001508b1:
  pcStack_410 = (code *)0x1508b6;
  run_schnorrsig_tests_cold_64();
LAB_001508b6:
  pcStack_410 = (code *)0x1508bb;
  run_schnorrsig_tests_cold_63();
LAB_001508bb:
  pcStack_410 = (code *)0x1508c0;
  run_schnorrsig_tests_cold_62();
LAB_001508c0:
  pcStack_410 = (code *)0x1508c5;
  run_schnorrsig_tests_cold_41();
LAB_001508c5:
  pcStack_410 = (code *)0x1508ca;
  run_schnorrsig_tests_cold_61();
LAB_001508ca:
  pcStack_410 = (code *)0x1508cf;
  run_schnorrsig_tests_cold_60();
  psVar174 = keypair_00;
LAB_001508cf:
  keypair_00 = (secp256k1_context *)r;
  pcStack_410 = (code *)0x1508d4;
  run_schnorrsig_tests_cold_42();
LAB_001508d4:
  pcStack_410 = (code *)0x1508d9;
  run_schnorrsig_tests_cold_59();
LAB_001508d9:
  pcStack_410 = (code *)0x1508de;
  run_schnorrsig_tests_cold_58();
LAB_001508de:
  pcStack_410 = (code *)0x1508e3;
  run_schnorrsig_tests_cold_57();
LAB_001508e3:
  pcStack_410 = (code *)0x1508e8;
  run_schnorrsig_tests_cold_56();
LAB_001508e8:
  pcStack_410 = (code *)0x1508ed;
  run_schnorrsig_tests_cold_43();
  psVar181 = keypair_00;
  keypair_00 = psVar174;
LAB_001508ed:
  pcStack_410 = (code *)0x1508f2;
  run_schnorrsig_tests_cold_111();
LAB_001508f2:
  pcStack_410 = (code *)0x1508f7;
  run_schnorrsig_tests_cold_109();
LAB_001508f7:
  pcStack_410 = (code *)0x1508fc;
  run_schnorrsig_tests_cold_114();
LAB_001508fc:
  pcStack_410 = (code *)0x150901;
  run_schnorrsig_tests_cold_113();
LAB_00150901:
  pcStack_410 = (code *)0x150906;
  run_schnorrsig_tests_cold_108();
  extraparams = psVar166;
LAB_00150906:
  pcStack_410 = (code *)0x15090b;
  run_schnorrsig_tests_cold_107();
LAB_0015090b:
  pcStack_410 = (code *)0x150910;
  run_schnorrsig_tests_cold_106();
LAB_00150910:
  pcStack_410 = (code *)0x150915;
  run_schnorrsig_tests_cold_105();
LAB_00150915:
  pcStack_410 = (code *)0x15091a;
  run_schnorrsig_tests_cold_104();
LAB_0015091a:
  pcStack_410 = (code *)0x15091f;
  run_schnorrsig_tests_cold_103();
LAB_0015091f:
  pcStack_410 = (code *)0x150924;
  run_schnorrsig_tests_cold_102();
LAB_00150924:
  pcStack_410 = (code *)0x150929;
  run_schnorrsig_tests_cold_101();
LAB_00150929:
  pcStack_410 = (code *)0x15092e;
  run_schnorrsig_tests_cold_100();
LAB_0015092e:
  pcStack_410 = (code *)0x150933;
  run_schnorrsig_tests_cold_99();
LAB_00150933:
  pcStack_410 = (code *)0x150938;
  run_schnorrsig_tests_cold_2();
LAB_00150938:
  pcStack_410 = (code *)0x15093d;
  run_schnorrsig_tests_cold_3();
LAB_0015093d:
  pcStack_410 = (code *)0x150942;
  run_schnorrsig_tests_cold_98();
LAB_00150942:
  pcStack_410 = (code *)0x150947;
  run_schnorrsig_tests_cold_4();
LAB_00150947:
  pcStack_410 = (code *)0x15094c;
  run_schnorrsig_tests_cold_5();
LAB_0015094c:
  pcStack_410 = (code *)0x150951;
  run_schnorrsig_tests_cold_97();
LAB_00150951:
  pcStack_410 = (code *)0x150956;
  run_schnorrsig_tests_cold_6();
LAB_00150956:
  pcStack_410 = (code *)0x15095b;
  run_schnorrsig_tests_cold_7();
LAB_0015095b:
  pcStack_410 = (code *)0x150960;
  run_schnorrsig_tests_cold_96();
LAB_00150960:
  pcStack_410 = (code *)0x150965;
  run_schnorrsig_tests_cold_8();
LAB_00150965:
  pcStack_410 = (code *)0x15096a;
  run_schnorrsig_tests_cold_9();
LAB_0015096a:
  pcStack_410 = (code *)0x15096f;
  run_schnorrsig_tests_cold_95();
LAB_0015096f:
  pcStack_410 = (code *)0x150974;
  run_schnorrsig_tests_cold_10();
LAB_00150974:
  pcStack_410 = (code *)0x150979;
  run_schnorrsig_tests_cold_11();
LAB_00150979:
  pcStack_410 = (code *)0x15097e;
  run_schnorrsig_tests_cold_94();
LAB_0015097e:
  pcStack_410 = (code *)0x150983;
  run_schnorrsig_tests_cold_93();
LAB_00150983:
  pcStack_410 = (code *)0x150988;
  run_schnorrsig_tests_cold_12();
LAB_00150988:
  pcStack_410 = (code *)0x15098d;
  run_schnorrsig_tests_cold_13();
LAB_0015098d:
  pcStack_410 = (code *)0x150992;
  run_schnorrsig_tests_cold_92();
LAB_00150992:
  pcStack_410 = (code *)0x150997;
  run_schnorrsig_tests_cold_14();
LAB_00150997:
  pcStack_410 = (code *)0x15099c;
  run_schnorrsig_tests_cold_15();
LAB_0015099c:
  pcStack_410 = (code *)0x1509a1;
  run_schnorrsig_tests_cold_91();
LAB_001509a1:
  pcStack_410 = (code *)0x1509a6;
  run_schnorrsig_tests_cold_90();
LAB_001509a6:
  pcStack_410 = (code *)0x1509ab;
  run_schnorrsig_tests_cold_16();
LAB_001509ab:
  pcStack_410 = (code *)0x1509b0;
  run_schnorrsig_tests_cold_17();
LAB_001509b0:
  pcStack_410 = (code *)0x1509b5;
  run_schnorrsig_tests_cold_89();
LAB_001509b5:
  pcStack_410 = (code *)0x1509ba;
  run_schnorrsig_tests_cold_18();
LAB_001509ba:
  pcStack_410 = (code *)0x1509bf;
  run_schnorrsig_tests_cold_19();
LAB_001509bf:
  pcStack_410 = (code *)0x1509c4;
  run_schnorrsig_tests_cold_88();
LAB_001509c4:
  pcStack_410 = (code *)0x1509c9;
  run_schnorrsig_tests_cold_87();
LAB_001509c9:
  pcStack_410 = (code *)0x1509ce;
  run_schnorrsig_tests_cold_20();
LAB_001509ce:
  pcStack_410 = (code *)0x1509d3;
  run_schnorrsig_tests_cold_21();
LAB_001509d3:
  pcStack_410 = (code *)0x1509d8;
  run_schnorrsig_tests_cold_86();
LAB_001509d8:
  pcStack_410 = (code *)0x1509dd;
  run_schnorrsig_tests_cold_22();
LAB_001509dd:
  pcStack_410 = (code *)0x1509e2;
  run_schnorrsig_tests_cold_23();
LAB_001509e2:
  pcStack_410 = (code *)0x1509e7;
  run_schnorrsig_tests_cold_85();
LAB_001509e7:
  pcStack_410 = (code *)0x1509ec;
  run_schnorrsig_tests_cold_84();
LAB_001509ec:
  pcStack_410 = (code *)0x1509f1;
  run_schnorrsig_tests_cold_83();
LAB_001509f1:
  pcStack_410 = (code *)0x1509f6;
  run_schnorrsig_tests_cold_24();
LAB_001509f6:
  pcStack_410 = (code *)0x1509fb;
  run_schnorrsig_tests_cold_82();
LAB_001509fb:
  pcStack_410 = (code *)0x150a00;
  run_schnorrsig_tests_cold_25();
LAB_00150a00:
  pcStack_410 = (code *)0x150a05;
  run_schnorrsig_tests_cold_26();
LAB_00150a05:
  pcStack_410 = (code *)0x150a0a;
  run_schnorrsig_tests_cold_81();
LAB_00150a0a:
  pcStack_410 = (code *)0x150a0f;
  run_schnorrsig_tests_cold_27();
LAB_00150a0f:
  pcStack_410 = (code *)0x150a14;
  run_schnorrsig_tests_cold_80();
LAB_00150a14:
  pcStack_410 = (code *)0x150a19;
  run_schnorrsig_tests_cold_28();
LAB_00150a19:
  pcStack_410 = (code *)0x150a1e;
  run_schnorrsig_tests_cold_29();
LAB_00150a1e:
  pcStack_410 = (code *)0x150a23;
  run_schnorrsig_tests_cold_30();
LAB_00150a23:
  pcStack_410 = (code *)0x150a28;
  run_schnorrsig_tests_cold_31();
LAB_00150a28:
  pcStack_410 = (code *)0x150a2d;
  run_schnorrsig_tests_cold_55();
LAB_00150a2d:
  pcStack_410 = (code *)0x150a32;
  run_schnorrsig_tests_cold_54();
LAB_00150a32:
  pcStack_410 = (code *)0x150a37;
  run_schnorrsig_tests_cold_53();
LAB_00150a37:
  pcStack_410 = (code *)0x150a3c;
  run_schnorrsig_tests_cold_44();
LAB_00150a3c:
  pcStack_410 = (code *)0x150a41;
  run_schnorrsig_tests_cold_52();
LAB_00150a41:
  pcStack_410 = (code *)0x150a46;
  run_schnorrsig_tests_cold_51();
LAB_00150a46:
  pcStack_410 = (code *)0x150a4b;
  run_schnorrsig_tests_cold_50();
LAB_00150a4b:
  pcStack_410 = (code *)0x150a50;
  run_schnorrsig_tests_cold_49();
LAB_00150a50:
  pcStack_410 = (code *)0x150a55;
  run_schnorrsig_tests_cold_48();
LAB_00150a55:
  pcStack_410 = (code *)0x150a5a;
  run_schnorrsig_tests_cold_47();
LAB_00150a5a:
  pcStack_410 = (code *)0x150a5f;
  run_schnorrsig_tests_cold_46();
LAB_00150a5f:
  pcStack_410 = (code *)0x150a64;
  run_schnorrsig_tests_cold_45();
LAB_00150a64:
  r = pubkey_00;
  pcStack_410 = (code *)0x150a69;
  run_schnorrsig_tests_cold_32();
LAB_00150a69:
  pcStack_410 = (code *)0x150a6e;
  run_schnorrsig_tests_cold_34();
  psVar166 = extraparams;
  pubkey_00 = r;
LAB_00150a6e:
  r = (code *)psVar181;
  pcStack_410 = (code *)0x150a73;
  run_schnorrsig_tests_cold_36();
LAB_00150a73:
  pcStack_410 = (code *)0x150a78;
  run_schnorrsig_tests_cold_37();
  psVar181 = (secp256k1_context *)r;
LAB_00150a78:
  pcStack_410 = run_musig_tests;
  run_schnorrsig_tests_cold_1();
  auStack_4c0._136_8_ = psVar166;
  psStack_430 = pubkey;
  psStack_428 = psVar181;
  psStack_420 = keypair_00;
  psStack_418 = (secp256k1_context *)pubkey_00;
  pcStack_410 = unaff_RBP;
  if (0 < COUNT) {
    nonce_01 = (musig_sign_verify_vector *)(auStack_920 + 0x44);
    uVar169 = 0;
    do {
      plVar176 = (long *)auStack_be0;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150ae3;
      uStack_d50 = uVar169;
      testrand256(auStack_740 + 0x20);
      bVar161 = true;
      sha2 = (musig_tweak_vector *)asStack_da0;
      pmVar179 = (musig_key_agg_vector *)(auStack_be0 + 0x10);
      keyagg_cache = (musig_sign_verify_vector *)auStack_bb0;
      keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_bc0;
      pmVar167 = (musig_sign_verify_vector *)auStack_a60;
      pmVar185 = (musig_sign_verify_vector *)aiStack_d40;
      pubnonce = (musig_sign_verify_vector *)auStack_960;
      psVar162 = (secp256k1_musig_secnonce *)auStack_700;
LAB_00150b20:
      pmStackY_df8 = (musig_sign_verify_vector *)0x150b41;
      psStack_d48 = psVar162;
      testrand256(pmVar185->sk);
      *(musig_sign_verify_vector **)((musig_sign_verify_vector *)pmVar179)->sk = keyagg_cache;
      *(musig_sign_verify_vector **)((musig_sign_verify_vector *)keyagg_cache_00)->sk = pubnonce;
      *plVar176 = (long)sha2;
      sha2 = (musig_tweak_vector *)auStack_b30;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150b6a;
      uVar165 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)sha2,pmVar185->sk);
      keyagg_cache_00 = (musig_nonce_agg_vector *)(ulong)uVar165;
      *(undefined8 *)keyagg_cache->sk = auStack_b30._32_8_;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->scalar_offset).d[0] = uStack_b08;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->scalar_offset).d[1] = uStack_b00;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->scalar_offset).d[2] = uStack_af8;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->scalar_offset).d[3] = uStack_af0;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->ge_offset).x.n[0] = uStack_ae8;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->ge_offset).x.n[1] = uStack_ae0;
      (((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->ge_offset).x.n[2] = uStack_ad8;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150bad;
      pmVar175 = pmVar167;
      memcpy(pmVar167,sha2,0x60);
      pmVar179 = (musig_key_agg_vector *)pmVar167;
      if (uVar165 == 0) {
        pmStackY_df8 = (musig_sign_verify_vector *)0x15287c;
        run_musig_tests_cold_98();
        goto LAB_0015287c;
      }
      if (bVar161) goto code_r0x00150bc1;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150c76;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_nonce_gen_counter
                          (CTX,psStack_d48,(secp256k1_musig_pubnonce *)pubnonce,0,
                           (secp256k1_keypair *)pmVar167,(uchar *)0x0,
                           (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
      if (iVar147 == 0) goto LAB_001528d6;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150ca3;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_pubkey_agg
                          (CTX,(secp256k1_xonly_pubkey *)auStack_9a0,
                           (secp256k1_musig_keyagg_cache *)sha2,
                           (secp256k1_pubkey **)(auStack_be0 + 0x10),2);
      if (iVar147 == 0) goto LAB_001528db;
      keyagg_cache_00 = (musig_nonce_agg_vector *)&sStack_d00;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150ccf;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_nonce_agg
                          (CTX,(secp256k1_musig_aggnonce *)keyagg_cache_00,
                           (secp256k1_musig_pubnonce **)auStack_bc0,2);
      if (iVar147 == 0) goto LAB_001528e0;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150cf9;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_nonce_process
                          (CTX,(secp256k1_musig_session *)auStack_c70,
                           (secp256k1_musig_aggnonce *)keyagg_cache_00,auStack_740 + 0x20,
                           (secp256k1_musig_keyagg_cache *)sha2);
      if (iVar147 == 0) goto LAB_001528e5;
      pubnonce = (musig_sign_verify_vector *)CONCAT71((int7)((ulong)pubnonce >> 8),1);
      sha2 = (musig_tweak_vector *)asStack_da0;
      keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_bb0;
      keypair = (secp256k1_keypair *)auStack_a60;
      psVar162 = (secp256k1_musig_secnonce *)auStack_700;
      pmVar185 = (musig_sign_verify_vector *)auStack_960;
      do {
        keyagg_cache = (musig_sign_verify_vector *)auStack_b30;
        pmVar179 = (musig_key_agg_vector *)auStack_c70;
        pmStackY_df8 = (musig_sign_verify_vector *)0x150d4e;
        pmVar175 = (musig_sign_verify_vector *)CTX;
        iVar147 = secp256k1_musig_partial_sign
                            (CTX,(secp256k1_musig_partial_sig *)sha2,psVar162,keypair,
                             (secp256k1_musig_keyagg_cache *)keyagg_cache,
                             (secp256k1_musig_session *)pmVar179);
        if (iVar147 == 0) goto LAB_00152881;
        pmStackY_df8 = (musig_sign_verify_vector *)0x150d71;
        pmVar175 = (musig_sign_verify_vector *)CTX;
        iVar147 = secp256k1_musig_partial_sig_verify
                            (CTX,(secp256k1_musig_partial_sig *)sha2,
                             (secp256k1_musig_pubnonce *)pmVar185,
                             (secp256k1_pubkey *)keyagg_cache_00,
                             (secp256k1_musig_keyagg_cache *)keyagg_cache,
                             (secp256k1_musig_session *)pmVar179);
        if (iVar147 != 1) goto LAB_00152886;
        sha2 = (musig_tweak_vector *)(asStack_da0 + 1);
        keyagg_cache_00 = (musig_nonce_agg_vector *)(auStack_bb0 + 0x40);
        keypair = (secp256k1_keypair *)auStack_a00;
        cVar164 = (char)pubnonce;
        pubnonce = (musig_sign_verify_vector *)0x0;
        psVar162 = (secp256k1_musig_secnonce *)(auStack_700 + 0x84);
        pmVar185 = nonce_01;
      } while (cVar164 != '\0');
      pmVar167 = (musig_sign_verify_vector *)(auStack_700 + 0x240);
      pubnonce = (musig_sign_verify_vector *)auStack_be0;
      pmStackY_df8 = (musig_sign_verify_vector *)0x150dd4;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_partial_sig_agg
                          (CTX,(uchar *)pmVar167,(secp256k1_musig_session *)auStack_c70,
                           (secp256k1_musig_partial_sig **)pubnonce,2);
      sha2 = (musig_tweak_vector *)pmVar167;
      if (iVar147 != 1) goto LAB_001528f4;
      sha2 = (musig_tweak_vector *)(auStack_740 + 0x20);
      pmStackY_df8 = (musig_sign_verify_vector *)0x150e04;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pmVar167,(uchar *)sha2,0x20,
                           (secp256k1_xonly_pubkey *)auStack_9a0);
      if (iVar147 == 0) goto LAB_001528f9;
      uVar165 = (int)uStack_d50 + 1;
      uVar169 = (ulong)uVar165;
    } while ((int)uVar165 < COUNT);
  }
  pmStackY_df8 = (musig_sign_verify_vector *)0x150e2f;
  musig_api_tests();
  pmStackY_df8 = (musig_sign_verify_vector *)0x150e44;
  testrand_bytes_test(auStack_a60,0x20);
  pmStackY_df8 = (musig_sign_verify_vector *)0x150e59;
  testrand_bytes_test(auStack_c70,0x20);
  pmStackY_df8 = (musig_sign_verify_vector *)0x150e6e;
  testrand_bytes_test(auStack_b30,0x21);
  pmStackY_df8 = (musig_sign_verify_vector *)0x150e83;
  testrand_bytes_test(sStack_d00.data,0x20);
  pmStackY_df8 = (musig_sign_verify_vector *)0x150e98;
  testrand_bytes_test(auStack_bb0,0x20);
  pmStackY_df8 = (musig_sign_verify_vector *)0x150eaa;
  testrand_bytes_test(asStack_da0[0].data,0x20);
  auStack_700 = (undefined1  [8])auStack_a60;
  psStack_6f8 = &sStack_d00;
  puStack_6f0 = auStack_c70;
  puStack_6e8 = auStack_b30;
  puStack_6e0 = auStack_bb0;
  psStack_6d8 = asStack_da0;
  if (0 < COUNT) {
    iVar147 = 0;
    do {
      pmStackY_df8 = (musig_sign_verify_vector *)0x150f01;
      musig_nonce_bitflip((uchar **)auStack_700,0,0x20);
      pmStackY_df8 = (musig_sign_verify_vector *)0x150f13;
      musig_nonce_bitflip((uchar **)auStack_700,1,0x20);
      pmStackY_df8 = (musig_sign_verify_vector *)0x150f25;
      musig_nonce_bitflip((uchar **)auStack_700,2,0x20);
      pmStackY_df8 = (musig_sign_verify_vector *)0x150f37;
      musig_nonce_bitflip((uchar **)auStack_700,3,0x21);
      pmStackY_df8 = (musig_sign_verify_vector *)0x150f49;
      musig_nonce_bitflip((uchar **)auStack_700,4,0x20);
      pmStackY_df8 = (musig_sign_verify_vector *)0x150f5b;
      musig_nonce_bitflip((uchar **)auStack_700,5,0x20);
      iVar147 = iVar147 + 1;
    } while (iVar147 < COUNT);
  }
  pmVar182 = (musig_sign_verify_vector *)(auStack_920 + 0x44);
  sStack_d00.data[0x10] = (undefined1)uStack_a50;
  sStack_d00.data[0x11] = uStack_a50._1_1_;
  sStack_d00.data[0x12] = uStack_a50._2_1_;
  sStack_d00.data[0x13] = uStack_a50._3_1_;
  sStack_d00.data[0x14] = uStack_a50._4_1_;
  sStack_d00.data[0x15] = uStack_a50._5_1_;
  sStack_d00.data[0x16] = uStack_a50._6_1_;
  sStack_d00.data[0x17] = uStack_a50._7_1_;
  sStack_d00.data[0x18] = (undefined1)uStack_a48;
  sStack_d00.data[0x19] = uStack_a48._1_1_;
  sStack_d00.data[0x1a] = uStack_a48._2_1_;
  sStack_d00.data[0x1b] = uStack_a48._3_1_;
  sStack_d00.data[0x1c] = uStack_a48._4_1_;
  sStack_d00.data[0x1d] = uStack_a48._5_1_;
  sStack_d00.data[0x1e] = uStack_a48._6_1_;
  sStack_d00.data[0x1f] = uStack_a48._7_1_;
  sStack_d00.data[0] = auStack_a60[0];
  sStack_d00.data[1] = auStack_a60[1];
  sStack_d00.data[2] = auStack_a60[2];
  sStack_d00.data[3] = auStack_a60[3];
  sStack_d00.data[4] = auStack_a60[4];
  sStack_d00.data[5] = auStack_a60[5];
  sStack_d00.data[6] = auStack_a60[6];
  sStack_d00.data[7] = auStack_a60[7];
  sStack_d00.data[8] = auStack_a60[8];
  sStack_d00.data[9] = auStack_a60[9];
  sStack_d00.data[10] = auStack_a60[10];
  sStack_d00.data[0xb] = auStack_a60[0xb];
  sStack_d00.data[0xc] = auStack_a60[0xc];
  sStack_d00.data[0xd] = auStack_a60[0xd];
  sStack_d00.data[0xe] = auStack_a60[0xe];
  sStack_d00.data[0xf] = auStack_a60[0xf];
  auStack_c70._0_8_ = auStack_a60._0_8_;
  auStack_c70._8_8_ = auStack_a60._8_8_;
  auStack_c70._16_8_ = uStack_a50;
  auStack_c70._24_8_ = uStack_a48;
  auStack_b30._0_8_ = auStack_a60._0_8_;
  auStack_b30._8_8_ = auStack_a60._8_8_;
  auStack_b30._16_8_ = uStack_a50;
  auStack_b30._24_8_ = uStack_a48;
  auStack_bb0._0_8_ = auStack_a60._0_8_;
  auStack_bb0._8_8_ = auStack_a60._8_8_;
  auStack_bb0._16_8_ = uStack_a50;
  auStack_bb0._24_8_ = uStack_a48;
  asStack_da0[0].data._0_4_ = (undefined4)auStack_a60._0_8_;
  asStack_da0[0].data._4_4_ = SUB84(auStack_a60._0_8_,4);
  asStack_da0[0].data._8_4_ = (undefined4)auStack_a60._8_8_;
  asStack_da0[0].data._12_4_ = SUB84(auStack_a60._8_8_,4);
  asStack_da0[0].data._16_4_ = (undefined4)uStack_a50;
  asStack_da0[0].data._20_4_ = (undefined4)(uStack_a50 >> 0x20);
  asStack_da0[0].data._24_4_ = (undefined4)uStack_a48;
  asStack_da0[0].data._28_4_ = (undefined4)(uStack_a48 >> 0x20);
  pubnonce = (musig_sign_verify_vector *)auStack_a60;
  pmStackY_df8 = (musig_sign_verify_vector *)0x151019;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)auStack_960,(uchar *)pubnonce,sStack_d00.data,auStack_c70,
             auStack_b30,auStack_bb0,asStack_da0[0].data);
  sha2 = (musig_tweak_vector *)0x0;
  pmStackY_df8 = (musig_sign_verify_vector *)0x15103a;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)auStack_920,(uchar *)pubnonce,(uchar *)0x0,auStack_c70,auStack_b30,
             auStack_bb0,asStack_da0[0].data);
  pmStackY_df8 = (musig_sign_verify_vector *)0x15105e;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_920 + 0x40),(uchar *)pubnonce,sStack_d00.data,(uchar *)0x0
             ,auStack_b30,auStack_bb0,asStack_da0[0].data);
  pmStackY_df8 = (musig_sign_verify_vector *)0x151083;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_8dc + 0x3c),(uchar *)pubnonce,sStack_d00.data,auStack_c70,
             (uchar *)0x0,auStack_bb0,asStack_da0[0].data);
  pmStackY_df8 = (musig_sign_verify_vector *)0x1510ab;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_8dc + 0x7c),(uchar *)pubnonce,sStack_d00.data,auStack_c70,
             auStack_b30,(uchar *)0x0,asStack_da0[0].data);
  pmStackY_df8 = (musig_sign_verify_vector *)0x1510cf;
  secp256k1_nonce_function_musig
            (asStack_820,(uchar *)pubnonce,sStack_d00.data,auStack_c70,auStack_b30,auStack_bb0,
             (uchar *)0x0);
  pmVar153 = (musig_sign_verify_vector *)0x5;
  pmVar167 = (musig_sign_verify_vector *)(auStack_920 + 0x38);
  keyagg_cache = (musig_sign_verify_vector *)auStack_700;
  do {
    lVar152 = (long)sha2 * 0x40;
    pmVar175 = *(musig_sign_verify_vector **)(auStack_960 + lVar152 + 0x20);
    keyagg_cache_00 = *(musig_nonce_agg_vector **)(auStack_920 + lVar152 + -8);
    nonce_01 = (musig_sign_verify_vector *)
               (*(ulong *)(auStack_960 + lVar152 + 0x10) ^ *(ulong *)(auStack_920 + lVar152 + -0x10)
               | *(ulong *)(auStack_960 + lVar152 + 8) ^
                 *(ulong *)(auStack_920 + (long)sha2 * 0x40 + -0x18) |
                 *(ulong *)(auStack_960 + lVar152) ^ (ulong)pmVar175);
    pmVar179 = (musig_key_agg_vector *)
               (*(ulong *)(auStack_960 + lVar152 + 0x18) ^ (ulong)keyagg_cache_00 | (ulong)nonce_01)
    ;
    if ((musig_sign_verify_vector *)pmVar179 == (musig_sign_verify_vector *)0x0) goto LAB_001528cc;
    pmVar179 = (musig_key_agg_vector *)pmVar153;
    pmVar185 = pmVar167;
    if (sha2 < (musig_sign_verify_vector *)0x5) {
      do {
        if ((((*(ulong *)(auStack_960 + lVar152) ==
               pmVar185[-1].verify_error_case[1].nonce_indices_len) &&
             (*(ulong *)(auStack_960 + lVar152 + 8) ==
              pmVar185[-1].verify_error_case[1].nonce_indices[0])) &&
            (*(ulong *)(auStack_960 + lVar152 + 0x10) ==
             pmVar185[-1].verify_error_case[1].nonce_indices[1])) &&
           (*(ulong *)(auStack_960 + lVar152 + 0x18) ==
            pmVar185[-1].verify_error_case[1].nonce_indices[2])) goto LAB_0015288b;
        if (((pmVar175 == (musig_sign_verify_vector *)pmVar185[-1].verify_error_case[1].msg_index)
            && (*(ulong *)(auStack_920 + (long)sha2 * 0x40 + -0x18) ==
                pmVar185[-1].verify_error_case[1].signer_index)) &&
           ((*(ulong *)(auStack_920 + lVar152 + -0x10) ==
             *(ulong *)&pmVar185[-1].verify_error_case[1].error &&
            (cache_i = keyagg_cache, nonce_01 = pmVar185,
            (musig_sign_verify_vector *)keyagg_cache_00 ==
            *(musig_sign_verify_vector **)pmVar185->sk)))) goto LAB_00152890;
        pmVar185 = (musig_sign_verify_vector *)
                   ((((secp256k1_ecmult_gen_context *)pmVar185->sk)->ge_offset).x.n + 3);
        pmVar179 = (musig_key_agg_vector *)
                   &((musig_sign_verify_vector *)((long)pmVar179 + -0xc98))->verify_error_case[1].
                    field_0x77;
      } while (pmVar179 != (musig_key_agg_vector *)0x0);
    }
    sha2 = (musig_tweak_vector *)
           ((long)&((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)sha2)->sk)->built +
           1);
    pmVar153 = (musig_sign_verify_vector *)&pmVar153[-1].verify_error_case[1].field_0x77;
    pmVar167 = (musig_sign_verify_vector *)
               ((((secp256k1_ecmult_gen_context *)pmVar167->sk)->ge_offset).x.n + 3);
  } while ((musig_sign_verify_vector *)sha2 != (musig_sign_verify_vector *)0x6);
  if (0 < COUNT) {
    iVar147 = 0;
    do {
      sha2 = (musig_tweak_vector *)(auStack_c70 + 0x20);
      cache_i = (musig_sign_verify_vector *)auStack_700;
      keyagg_cache = (musig_sign_verify_vector *)auStack_b30;
      pubnonce = (musig_sign_verify_vector *)CONCAT71((int7)((ulong)pubnonce >> 8),1);
      puVar156 = asStack_da0[0].data;
      keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_a60;
      pmVar167 = (musig_sign_verify_vector *)auStack_c70;
      do {
        *(musig_nonce_agg_vector **)puVar156 = keyagg_cache_00;
        pmStackY_df8 = (musig_sign_verify_vector *)0x1511f9;
        testrand256(pmVar167->sk);
        pmStackY_df8 = (musig_sign_verify_vector *)0x15120b;
        pmVar175 = (musig_sign_verify_vector *)CTX;
        iVar150 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)cache_i,pmVar167->sk);
        *(uchar **)((musig_sign_verify_vector *)keyagg_cache_00)->sk = puStack_6e0;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        scalar_offset).d[0] = (uint64_t)psStack_6d8;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        scalar_offset).d[1] = uStack_6d0;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        scalar_offset).d[2] = uStack_6c8;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        scalar_offset).d[3] = uStack_6c0;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        ge_offset).x.n[0] = uStack_6b8;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        ge_offset).x.n[1] = uStack_6b0;
        (((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)->
        ge_offset).x.n[2] = uStack_6a8;
        pmVar185 = (musig_sign_verify_vector *)sha2;
        if (iVar150 == 0) goto LAB_0015289f;
        puVar156 = asStack_da0[0].data + 8;
        keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_a20;
        cVar164 = (char)pubnonce;
        pubnonce = (musig_sign_verify_vector *)0x0;
        pmVar167 = (musig_sign_verify_vector *)sha2;
      } while (cVar164 != '\0');
      pmStackY_df8 = (musig_sign_verify_vector *)0x151275;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar150 = secp256k1_musig_pubkey_agg
                          (CTX,(secp256k1_xonly_pubkey *)cache_i,
                           (secp256k1_musig_keyagg_cache *)keyagg_cache,
                           (secp256k1_pubkey **)asStack_da0,2);
      if (iVar150 == 0) goto LAB_00152926;
      pmStackY_df8 = (musig_sign_verify_vector *)0x151293;
      musig_tweak_test_helper
                ((secp256k1_xonly_pubkey *)cache_i,auStack_c70,(uchar *)sha2,
                 (secp256k1_musig_keyagg_cache *)keyagg_cache);
      pmStackY_df8 = (musig_sign_verify_vector *)0x1512aa;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar150 = secp256k1_musig_pubkey_get
                          (CTX,(secp256k1_pubkey *)auStack_960,
                           (secp256k1_musig_keyagg_cache *)keyagg_cache);
      pmVar179 = (musig_key_agg_vector *)keyagg_cache;
      nonce_01 = (musig_sign_verify_vector *)sha2;
      if (iVar150 == 0) goto LAB_0015292b;
      pubnonce = (musig_sign_verify_vector *)0x1;
      cache_i = (musig_sign_verify_vector *)auStack_920;
      do {
        uVar146 = secp256k1_test_state[0];
        uVar169 = secp256k1_test_state[3] + secp256k1_test_state[0];
        uVar163 = secp256k1_test_state[1] << 0x11;
        uVar170 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar154 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar170;
        secp256k1_test_state[0] = uVar154 ^ secp256k1_test_state[0];
        secp256k1_test_state[2] = uVar170 ^ uVar163;
        secp256k1_test_state[3] = uVar154 << 0x2d | uVar154 >> 0x13;
        pmVar185 = (musig_sign_verify_vector *)auStack_bb0;
        pmStackY_df8 = (musig_sign_verify_vector *)0x15132c;
        testrand256((uchar *)pmVar185);
        keyagg_cache = (musig_sign_verify_vector *)((long)pubnonce * 0x40);
        keyagg_cache_00 =
             (musig_nonce_agg_vector *)((uVar169 * 0x800000 | uVar169 >> 0x29) + uVar146);
        sha2 = (musig_tweak_vector *)(auStack_960 + (long)pubnonce * 0x40);
        pmVar175 = (musig_sign_verify_vector *)CTX;
        if ((long)keyagg_cache_00 < 0) {
          pmStackY_df8 = (musig_sign_verify_vector *)0x151371;
          iVar150 = secp256k1_musig_pubkey_tweak_add_internal
                              (CTX,(secp256k1_pubkey *)sha2,
                               (secp256k1_musig_keyagg_cache *)auStack_b30,(uchar *)pmVar185,1);
          pmVar168 = (musig_sig_agg_vector *)sha2;
          if (iVar150 == 0) goto LAB_001528b8;
        }
        else {
          pmStackY_df8 = (musig_sign_verify_vector *)0x15135d;
          iVar150 = secp256k1_musig_pubkey_tweak_add_internal
                              (CTX,(secp256k1_pubkey *)sha2,
                               (secp256k1_musig_keyagg_cache *)auStack_b30,(uchar *)pmVar185,0);
          if (iVar150 == 0) goto LAB_001528a9;
        }
        pmVar185 = (musig_sign_verify_vector *)(auStack_700 + (long)pubnonce * 0x40);
        pmStackY_df8 = (musig_sign_verify_vector *)0x15139e;
        pmVar175 = (musig_sign_verify_vector *)CTX;
        iVar150 = secp256k1_xonly_pubkey_from_pubkey
                            (CTX,(secp256k1_xonly_pubkey *)pmVar185,aiStack_d40,
                             (secp256k1_pubkey *)sha2);
        if (iVar150 == 0) goto LAB_001528a4;
        pmVar175 = (musig_sign_verify_vector *)CTX;
        if ((long)keyagg_cache_00 < 0) {
          pmVar168 = (musig_sig_agg_vector *)&sStack_d00;
          pmStackY_df8 = (musig_sign_verify_vector *)0x151454;
          iVar150 = secp256k1_xonly_pubkey_serialize
                              (CTX,(uchar *)pmVar168,(secp256k1_xonly_pubkey *)pmVar185);
          if (iVar150 == 0) goto LAB_001528bd;
          pmStackY_df8 = (musig_sign_verify_vector *)0x15148a;
          pmVar175 = (musig_sign_verify_vector *)CTX;
          iVar150 = secp256k1_xonly_pubkey_tweak_add_check
                              (CTX,(uchar *)pmVar168,aiStack_d40[0],
                               (secp256k1_xonly_pubkey *)(auStack_740 + (long)keyagg_cache),
                               auStack_bb0);
          puVar156 = pubnonce->sk;
          pmVar167 = cache_i;
          if (iVar150 == 0) goto LAB_001528c2;
        }
        else {
          sStack_d00.data._0_8_ =
               *(undefined8 *)
                (auStack_960 + (long)(keyagg_cache[-1].verify_error_case[1].key_indices + 2));
          sStack_d00.data._8_8_ =
               *(undefined8 *)(keyagg_cache[-1].verify_error_case[1].sig + (long)auStack_920);
          sStack_d00.data._16_8_ =
               *(undefined8 *)
                (auStack_960 + (long)keyagg_cache[-1].verify_error_case[1].nonce_indices);
          sStack_d00.data._24_8_ =
               *(undefined8 *)
                (keyagg_cache[-1].verify_error_case[0].sig + (long)(auStack_8dc + 0x44));
          sStack_d00.data._32_8_ =
               *(undefined8 *)
                (auStack_960 + (long)(keyagg_cache[-1].verify_error_case[1].nonce_indices + 2));
          sStack_d00.data._40_8_ =
               *(undefined8 *)
                (keyagg_cache[-1].verify_error_case[0].sig + (long)(auStack_8dc + 0x54));
          sStack_d00.data._48_8_ =
               *(undefined8 *)
                (auStack_960 + (long)&keyagg_cache[-1].verify_error_case[1].signer_index);
          sStack_d00.data._56_8_ =
               *(undefined8 *)
                ((long)keyagg_cache[-1].verify_error_case[0].key_indices +
                (long)(auStack_8dc + 0x3c));
          pmStackY_df8 = (musig_sign_verify_vector *)0x15140b;
          iVar150 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)&sStack_d00,auStack_bb0);
          nonce_01 = pmVar185;
          if (iVar150 == 0) goto LAB_001528ae;
          lVar152 = 0;
          pmVar179 = (musig_key_agg_vector *)auStack_b30;
          do {
            if (sStack_d00.data[lVar152] !=
                *(uchar *)((long)(((secp256k1_ecmult_gen_context *)cache_i->sk)->scalar_offset).d +
                          lVar152 + -8)) goto LAB_00152921;
            lVar152 = lVar152 + 1;
          } while (lVar152 != 0x40);
        }
        pmStackY_df8 = (musig_sign_verify_vector *)0x1514b8;
        musig_tweak_test_helper
                  ((secp256k1_xonly_pubkey *)pmVar185,auStack_c70,auStack_c70 + 0x20,
                   (secp256k1_musig_keyagg_cache *)auStack_b30);
        pubnonce = (musig_sign_verify_vector *)
                   ((long)&((secp256k1_ecmult_gen_context *)pubnonce->sk)->built + 1);
        cache_i = (musig_sign_verify_vector *)
                  ((((secp256k1_ecmult_gen_context *)cache_i->sk)->ge_offset).x.n + 3);
      } while (pubnonce != (musig_sign_verify_vector *)0x9);
      iVar147 = iVar147 + 1;
      pubnonce = (musig_sign_verify_vector *)0x0;
    } while (iVar147 < COUNT);
  }
  sha2 = (musig_tweak_vector *)auStack_700;
  auStack_700 = (undefined1  [8])0xc8fff302b399d5e0;
  psStack_6f8 = (secp256k1_keypair *)0x7c5b7f16badac71;
  puStack_6f0 = (uchar *)0x2a72ecf89701e2ef;
  puStack_6e8 = (uchar *)0xab148a38201a4c7b;
  auStack_6a0[0] = '@';
  auStack_6a0[1] = '\0';
  auStack_6a0[2] = '\0';
  auStack_6a0[3] = '\0';
  auStack_6a0[4] = '\0';
  auStack_6a0[5] = '\0';
  auStack_6a0[6] = '\0';
  auStack_6a0[7] = '\0';
  pmStackY_df8 = (musig_sign_verify_vector *)0x151527;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_960,(uchar *)"KeyAgg list",0xb);
  pmStackY_df8 = (musig_sign_verify_vector *)0x151532;
  test_sha256_eq((secp256k1_sha256 *)auStack_960,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0x6a480de6ef02c5a;
  psStack_6f8 = (secp256k1_keypair *)0x1d1134f21f298665;
  puStack_6f0 = (uchar *)0x52da414756a0b063;
  puStack_6e8 = (uchar *)0x4484be15f280d9d4;
  auStack_6a0[0] = '@';
  auStack_6a0[1] = '\0';
  auStack_6a0[2] = '\0';
  auStack_6a0[3] = '\0';
  auStack_6a0[4] = '\0';
  auStack_6a0[5] = '\0';
  auStack_6a0[6] = '\0';
  auStack_6a0[7] = '\0';
  pmStackY_df8 = (musig_sign_verify_vector *)0x151567;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)auStack_960,(uchar *)"KeyAgg coefficient",0x12);
  pmStackY_df8 = (musig_sign_verify_vector *)0x151572;
  test_sha256_eq((secp256k1_sha256 *)auStack_960,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0xf463fe7ea19e884b;
  psStack_6f8 = (secp256k1_keypair *)0xbeb0f9ff2f18f9a2;
  puStack_6f0 = (uchar *)0x6ebd26f0f37e8b0;
  puStack_6e8 = (uchar *)0x522fb150e3b243d2;
  auStack_6a0[0] = '@';
  auStack_6a0[1] = '\0';
  auStack_6a0[2] = '\0';
  auStack_6a0[3] = '\0';
  auStack_6a0[4] = '\0';
  auStack_6a0[5] = '\0';
  auStack_6a0[6] = '\0';
  auStack_6a0[7] = '\0';
  pmStackY_df8 = (musig_sign_verify_vector *)0x1515a7;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_960,(uchar *)"MuSig/aux",9);
  pmStackY_df8 = (musig_sign_verify_vector *)0x1515b2;
  test_sha256_eq((secp256k1_sha256 *)auStack_960,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0x1800341407101b64;
  psStack_6f8 = (secp256k1_keypair *)0xe6258ee0391bc43;
  puStack_6f0 = (uchar *)0x8343937e29d26b72;
  puStack_6e8 = (uchar *)0xff568a30b7a0a4fb;
  auStack_6a0[0] = '@';
  auStack_6a0[1] = '\0';
  auStack_6a0[2] = '\0';
  auStack_6a0[3] = '\0';
  auStack_6a0[4] = '\0';
  auStack_6a0[5] = '\0';
  auStack_6a0[6] = '\0';
  auStack_6a0[7] = '\0';
  pmStackY_df8 = (musig_sign_verify_vector *)0x1515e7;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_960,(uchar *)"MuSig/nonce",0xb);
  pmStackY_df8 = (musig_sign_verify_vector *)0x1515f2;
  test_sha256_eq((secp256k1_sha256 *)auStack_960,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0x6bf7e532c7d5a45;
  psStack_6f8 = (secp256k1_keypair *)0x971254c089be68a6;
  puStack_6f0 = (uchar *)0x72846dcd60ac12d2;
  puStack_6e8 = (uchar *)0xde7a25006c81212f;
  auStack_6a0[0] = '@';
  auStack_6a0[1] = '\0';
  auStack_6a0[2] = '\0';
  auStack_6a0[3] = '\0';
  auStack_6a0[4] = '\0';
  auStack_6a0[5] = '\0';
  auStack_6a0[6] = '\0';
  auStack_6a0[7] = '\0';
  pmStackY_df8 = (musig_sign_verify_vector *)0x151627;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_960,(uchar *)"MuSig/noncecoef",0xf)
  ;
  pmStackY_df8 = (musig_sign_verify_vector *)0x151632;
  test_sha256_eq((secp256k1_sha256 *)auStack_960,(secp256k1_sha256 *)sha2);
  pubnonce = (musig_sign_verify_vector *)musig_key_agg_vector.valid_case[0].expected;
  keyagg_cache_00 = (musig_nonce_agg_vector *)0x0;
  pmVar179 = &musig_key_agg_vector;
  nonce_01 = (musig_sign_verify_vector *)musig_key_agg_vector.tweaks;
  keyagg_cache = (musig_sign_verify_vector *)auStack_b30;
  do {
    pmStackY_df8 = (musig_sign_verify_vector *)0x151692;
    pmVar175 = keyagg_cache;
    iVar147 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)keyagg_cache,(secp256k1_musig_keyagg_cache *)auStack_960,
                         (uchar *)sha2,(uchar (*) [33])&musig_key_agg_vector,
                         musig_key_agg_vector.tweaks,
                         musig_key_agg_vector.valid_case[(long)keyagg_cache_00].key_indices_len,
                         musig_key_agg_vector.valid_case[(long)keyagg_cache_00].key_indices,0,
                         (size_t *)0x0,(int *)0x0);
    if (iVar147 == 0) goto LAB_001528d1;
    lVar152 = 0;
    do {
      if (auStack_700[lVar152] !=
          *(char *)((long)(((secp256k1_ecmult_gen_context *)pubnonce->sk)->scalar_offset).d +
                   lVar152 + -8)) goto LAB_001529e4;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x20);
    keyagg_cache_00 =
         (musig_nonce_agg_vector *)
         ((long)&((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_00)->sk)
                 ->built + 1);
    pubnonce = (musig_sign_verify_vector *)
               ((((secp256k1_ecmult_gen_context *)pubnonce->sk)->ge_offset).x.n + 4);
  } while ((musig_sign_verify_vector *)keyagg_cache_00 != (musig_sign_verify_vector *)0x4);
  nonce_01 = (musig_sign_verify_vector *)0x0;
  sha2 = (musig_tweak_vector *)musig_key_agg_vector.tweaks;
  keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_960;
  do {
    pmVar175 = (musig_sign_verify_vector *)auStack_700;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151722;
    iVar147 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)keyagg_cache_00,
                         (uchar *)0x0,(uchar (*) [33])&musig_key_agg_vector,
                         musig_key_agg_vector.tweaks,
                         nonce_01[0x21d].verify_fail_case[0].key_indices[2],
                         &nonce_01[0x21d].verify_fail_case[0].nonce_indices_len,
                         nonce_01[0x21d].verify_fail_case[0].msg_index,
                         &nonce_01[0x21d].verify_fail_case[0].signer_index,
                         (int *)&nonce_01[0x21d].verify_fail_case[0].error);
    if (iVar147 != 0) goto LAB_001528ea;
    if (*(int *)&nonce_01[0x21d].verify_fail_case[0].field_0x74 != auStack_700._0_4_)
    goto LAB_001528ef;
    nonce_01 = (musig_sign_verify_vector *)
               ((((secp256k1_ecmult_gen_context *)nonce_01->sk)->ge_offset).x.n + 3);
  } while (nonce_01 != (musig_sign_verify_vector *)0x140);
  keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_c70;
  lVar152 = 0;
  bVar161 = true;
  do {
    bVar160 = bVar161;
    cache_i = (musig_sign_verify_vector *)auStack_960;
    nonce_01 = (musig_sign_verify_vector *)0x0;
    lVar155 = lVar152 * 0x178;
    pmVar179 = (musig_key_agg_vector *)(musig_nonce_gen_vector.test_case + lVar152);
    sStack_d00.data._0_8_ = *(undefined8 *)musig_nonce_gen_vector.test_case[lVar152].rand_;
    sStack_d00.data._8_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar152].rand_ + 8);
    sStack_d00.data._16_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar152].rand_ + 0x10)
    ;
    sStack_d00.data._24_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar152].rand_ + 0x18)
    ;
    pubnonce = (musig_sign_verify_vector *)musig_nonce_gen_vector.test_case[lVar152].sk;
    if (musig_nonce_gen_vector.test_case[lVar152].has_sk == 0) {
      pubnonce = nonce_01;
    }
    pmVar167 = (musig_sign_verify_vector *)0x0;
    if (musig_nonce_gen_vector.test_case[lVar152].has_aggpk != 0) {
      pmStackY_df8 = (musig_sign_verify_vector *)0x1517bd;
      memset(cache_i,0,0xf8);
      sha2 = (musig_tweak_vector *)auStack_b30;
      pmStackY_df8 = (musig_sign_verify_vector *)0x1517d9;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)sha2,
                           musig_nonce_gen_vector.test_case[lVar152].aggpk);
      if (iVar147 == 0) goto LAB_00152917;
      pmStackY_df8 = (musig_sign_verify_vector *)0x1517f3;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)cache_i,(secp256k1_pubkey *)sha2);
      if (iVar147 == 0) goto LAB_0015291c;
      pmVar167 = (musig_sign_verify_vector *)auStack_700;
      pmStackY_df8 = (musig_sign_verify_vector *)0x15180e;
      secp256k1_keyagg_cache_save
                ((secp256k1_musig_keyagg_cache *)pmVar167,(secp256k1_keyagg_cache_internal *)cache_i
                );
    }
    uVar165 = musig_nonce_gen_vector.test_case[lVar152].has_msg;
    nonce_01 = (musig_sign_verify_vector *)(ulong)uVar165;
    uVar151 = musig_nonce_gen_vector.test_case[lVar152].has_extra_in;
    keyagg_cache = (musig_sign_verify_vector *)(ulong)uVar151;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151837;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)keyagg_cache_00,
                         musig_nonce_gen_vector.test_case[lVar152].pk,0x21);
    sha2 = (musig_tweak_vector *)pmVar167;
    if (iVar147 == 0) goto LAB_001528fe;
    puVar156 = musig_nonce_gen_vector.test_case[lVar152].extra_in;
    if (uVar151 == 0) {
      puVar156 = (uchar *)0x0;
    }
    msg32 = musig_nonce_gen_vector.test_case[lVar152].msg;
    nonce_01 = (musig_sign_verify_vector *)0x0;
    if (uVar165 == 0) {
      msg32 = (uchar *)0x0;
    }
    keyagg_cache = (musig_sign_verify_vector *)auStack_960;
    sha2 = (musig_tweak_vector *)auStack_b30;
    pmStackY_df8 = (musig_sign_verify_vector *)0x1518a6;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_nonce_gen
                        (CTX,(secp256k1_musig_secnonce *)keyagg_cache,
                         (secp256k1_musig_pubnonce *)sha2,sStack_d00.data,pubnonce->sk,
                         (secp256k1_pubkey *)keyagg_cache_00,msg32,
                         (secp256k1_musig_keyagg_cache *)pmVar167,puVar156);
    if (iVar147 != 1) goto LAB_00152903;
    lVar152 = 0;
    do {
      if (auStack_960[lVar152 + 4] != *(char *)(lVar155 + 0x1aa9c4 + lVar152)) goto LAB_001529e9;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x40);
    lVar152 = 0;
    do {
      if (auStack_920[lVar152 + 4] != auStack_c70[lVar152]) goto LAB_001529ee;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x40);
    lVar152 = -0x21;
    do {
      if (*(char *)(lVar155 + 0x1aaa25 + lVar152) != *(char *)(lVar155 + 0x1aa955 + lVar152))
      goto LAB_001529f3;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0);
    pmStackY_df8 = (musig_sign_verify_vector *)0x151924;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_pubnonce_serialize(CTX,auStack_a60,(secp256k1_musig_pubnonce *)sha2);
    if (iVar147 == 0) goto LAB_00152908;
    lVar152 = 0;
    do {
      if (auStack_a60[lVar152] != *(char *)(lVar155 + 0x1aaa25 + lVar152)) goto LAB_001529f8;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x42);
    lVar152 = 1;
    bVar161 = false;
  } while (bVar160);
  pubnonce = (musig_sign_verify_vector *)CONCAT71((int7)((ulong)pubnonce >> 8),1);
  lVar152 = 0;
  keyagg_cache_00 = &musig_nonce_agg_vector;
  do {
    pmVar179 = (musig_key_agg_vector *)(musig_nonce_agg_vector.valid_case + lVar152);
    nonce_01 = (musig_sign_verify_vector *)0x1;
    sha2 = (musig_tweak_vector *)auStack_a60;
    lVar155 = 0;
    cache_i = (musig_sign_verify_vector *)auStack_960;
    do {
      pmStackY_df8 = (musig_sign_verify_vector *)0x1519aa;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)cache_i,
                           musig_nonce_agg_vector.pnonces
                           [(((secp256k1_ecmult_gen_context *)
                             ((musig_sign_verify_vector *)pmVar179)->sk)->scalar_offset).d
                            [lVar155 + -1]]);
      if (iVar147 == 0) goto LAB_00152895;
      *(musig_sign_verify_vector **)((musig_sign_verify_vector *)sha2)->sk = cache_i;
      lVar155 = 1;
      sha2 = (musig_tweak_vector *)(auStack_a60 + 8);
      cVar164 = (char)nonce_01;
      nonce_01 = (musig_sign_verify_vector *)0x0;
      cache_i = pmVar182;
    } while (cVar164 != '\0');
    sha2 = (musig_tweak_vector *)auStack_700;
    pmStackY_df8 = (musig_sign_verify_vector *)0x1519f7;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_nonce_agg
                        (CTX,(secp256k1_musig_aggnonce *)sha2,
                         (secp256k1_musig_pubnonce **)auStack_a60,2);
    if (iVar147 == 0) goto LAB_0015290d;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151a16;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_aggnonce_serialize(CTX,auStack_b30,(secp256k1_musig_aggnonce *)sha2);
    if (iVar147 == 0) goto LAB_00152912;
    lVar155 = 0;
    keyagg_cache = (musig_sign_verify_vector *)auStack_960;
    do {
      if (auStack_b30[lVar155] != *(char *)(lVar152 * 0x58 + 0x1aadc0 + lVar155)) goto LAB_001529fd;
      lVar155 = lVar155 + 1;
    } while (lVar155 != 0x21);
    lVar152 = 1;
    cVar164 = (char)pubnonce;
    pubnonce = (musig_sign_verify_vector *)0x0;
  } while (cVar164 != '\0');
  sha2 = (musig_tweak_vector *)0x0;
  do {
    pmVar179 = (musig_key_agg_vector *)(musig_nonce_agg_vector.error_case + (long)sha2);
    cache_i = (musig_sign_verify_vector *)
              (ulong)(uint)musig_nonce_agg_vector.error_case[(long)sha2].invalid_nonce_idx;
    pubnonce = (musig_sign_verify_vector *)0x1;
    pmVar167 = (musig_sign_verify_vector *)0x0;
    nonce_00 = (secp256k1_musig_pubnonce *)auStack_960;
    do {
      nonce_01 = (musig_sign_verify_vector *)(ulong)(pmVar167 != cache_i);
      pmStackY_df8 = (musig_sign_verify_vector *)0x151aa2;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      uVar165 = secp256k1_musig_pubnonce_parse
                          (CTX,nonce_00,
                           musig_nonce_agg_vector.pnonces
                           [(((secp256k1_ecmult_gen_context *)
                             ((musig_sign_verify_vector *)pmVar179)->sk)->scalar_offset).d
                            [(long)&pmVar167[-1].verify_error_case[1].field_0x77]]);
      if (uVar165 != (pmVar167 != cache_i)) goto LAB_0015289a;
      pmVar167 = (musig_sign_verify_vector *)0x1;
      cVar164 = (char)pubnonce;
      pubnonce = (musig_sign_verify_vector *)0x0;
      nonce_00 = (secp256k1_musig_pubnonce *)(auStack_920 + 0x44);
    } while (cVar164 != '\0');
    sha2 = (musig_tweak_vector *)
           ((long)&((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)sha2)->sk)->built +
           1);
  } while ((musig_sign_verify_vector *)sha2 != (musig_sign_verify_vector *)0x3);
  pmVar179 = (musig_key_agg_vector *)musig_sign_verify_vector.valid_case[0].expected;
  cache_i = (musig_sign_verify_vector *)0x0;
  pubnonce = &musig_sign_verify_vector;
  keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_a60;
  do {
    pmStackY_df8 = (musig_sign_verify_vector *)0x151afc;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_keypair_create(CTX,&sStack_d00,musig_sign_verify_vector.sk);
    sha2 = (musig_tweak_vector *)pubnonce;
    pmVar167 = (musig_sign_verify_vector *)&sStack_d00;
    if (iVar147 == 0) goto LAB_00152930;
    sha2 = (musig_tweak_vector *)(musig_sign_verify_vector.valid_case + (long)cache_i);
    pmVar175 = (musig_sign_verify_vector *)auStack_9a0;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151b52;
    iVar147 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)auStack_960,
                         (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                         *(size_t *)((musig_sign_verify_vector *)sha2)->sk,
                         musig_sign_verify_vector.valid_case[(long)cache_i].key_indices,0,
                         (size_t *)0x0,(int *)0x0);
    pmVar167 = cache_i;
    pmVar185 = (musig_sign_verify_vector *)keyagg_cache_00;
    if (iVar147 == 0) goto LAB_00152935;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151b89;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_aggnonce_parse
                        (CTX,(secp256k1_musig_aggnonce *)keyagg_cache_00,
                         musig_sign_verify_vector.aggnonces
                         [musig_sign_verify_vector.valid_case[(long)cache_i].aggnonce_index]);
    if (iVar147 == 0) goto LAB_0015293a;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151bc3;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_nonce_process
                        (CTX,(secp256k1_musig_session *)auStack_700,
                         (secp256k1_musig_aggnonce *)keyagg_cache_00,
                         musig_sign_verify_vector.msgs
                         [musig_sign_verify_vector.valid_case[(long)cache_i].msg_index],
                         (secp256k1_musig_keyagg_cache *)auStack_960);
    puVar156 = pubnonce->sk;
    pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
    if (iVar147 == 0) goto LAB_0015293f;
    pmVar167 = (musig_sign_verify_vector *)auStack_bb0;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151bf1;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)pmVar167,musig_sign_verify_vector.pubkeys[0],0x21);
    if (iVar147 == 0) goto LAB_00152944;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151c13;
    musig_test_set_secnonce
              ((secp256k1_musig_secnonce *)auStack_c70,musig_sign_verify_vector.secnonces[0],
               (secp256k1_pubkey *)pmVar167);
    puVar156 = sStack_d00.data;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151c42;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_partial_sign
                        (CTX,asStack_da0,(secp256k1_musig_secnonce *)auStack_c70,
                         (secp256k1_keypair *)puVar156,(secp256k1_musig_keyagg_cache *)auStack_960,
                         (secp256k1_musig_session *)auStack_700);
    nonce_01 = cache_i;
    if (iVar147 == 0) goto LAB_00152949;
    lVar152 = 0;
    nonce_01 = (musig_sign_verify_vector *)auStack_b30;
    do {
      sha2 = (musig_tweak_vector *)pubnonce;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      if (asStack_da0[0].data[lVar152] != secp256k1_musig_partial_sig_magic[lVar152])
      goto LAB_00152a16;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 4);
    aiStack_d40[1]._0_1_ = asStack_da0[0].data[8];
    aiStack_d40[1]._1_1_ = asStack_da0[0].data[9];
    aiStack_d40[1]._2_1_ = asStack_da0[0].data[10];
    aiStack_d40[1]._3_1_ = asStack_da0[0].data[0xb];
    aiStack_d40[0]._0_1_ = asStack_da0[0].data[4];
    aiStack_d40[0]._1_1_ = asStack_da0[0].data[5];
    aiStack_d40[0]._2_1_ = asStack_da0[0].data[6];
    aiStack_d40[0]._3_1_ = asStack_da0[0].data[7];
    auStack_d30[0] = asStack_da0[0].data[0x14];
    auStack_d30[1] = asStack_da0[0].data[0x15];
    auStack_d30[2] = asStack_da0[0].data[0x16];
    auStack_d30[3] = asStack_da0[0].data[0x17];
    auStack_d30[4] = asStack_da0[0].data[0x18];
    auStack_d30[5] = asStack_da0[0].data[0x19];
    auStack_d30[6] = asStack_da0[0].data[0x1a];
    auStack_d30[7] = asStack_da0[0].data[0x1b];
    auStack_d28[0] = asStack_da0[0].data[0x1c];
    auStack_d28[1] = asStack_da0[0].data[0x1d];
    auStack_d28[2] = asStack_da0[0].data[0x1e];
    auStack_d28[3] = asStack_da0[0].data[0x1f];
    auStack_d28[4] = asStack_da0[0].data[0x20];
    auStack_d28[5] = asStack_da0[0].data[0x21];
    auStack_d28[6] = asStack_da0[0].data[0x22];
    auStack_d28[7] = asStack_da0[0].data[0x23];
    auStack_d38[0] = asStack_da0[0].data[0xc];
    auStack_d38[1] = asStack_da0[0].data[0xd];
    auStack_d38[2] = asStack_da0[0].data[0xe];
    auStack_d38[3] = asStack_da0[0].data[0xf];
    auStack_d38[4] = asStack_da0[0].data[0x10];
    auStack_d38[5] = asStack_da0[0].data[0x11];
    auStack_d38[6] = asStack_da0[0].data[0x12];
    auStack_d38[7] = asStack_da0[0].data[0x13];
    lVar152 = 0;
    do {
      pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
      if (*(char *)((long)aiStack_d40 + lVar152) !=
          *(char *)((long)(((secp256k1_ecmult_gen_context *)
                           ((musig_sign_verify_vector *)pmVar179)->sk)->scalar_offset).d +
                   lVar152 + -8)) goto LAB_00152a1b;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x20);
    pmStackY_df8 = (musig_sign_verify_vector *)0x151cc2;
    iVar147 = secp256k1_musig_pubnonce_parse
                        (CTX,(secp256k1_musig_pubnonce *)nonce_01,
                         musig_sign_verify_vector.pubnonces[0]);
    if (iVar147 == 0) goto LAB_0015294e;
    pmStackY_df8 = (musig_sign_verify_vector *)0x151cf6;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_partial_sig_verify
                        (CTX,asStack_da0,(secp256k1_musig_pubnonce *)nonce_01,
                         (secp256k1_pubkey *)auStack_bb0,(secp256k1_musig_keyagg_cache *)auStack_960
                         ,(secp256k1_musig_session *)auStack_700);
    keyagg_cache = (musig_sign_verify_vector *)pmVar179;
    if (iVar147 == 0) goto LAB_00152953;
    cache_i = (musig_sign_verify_vector *)
              ((long)&((secp256k1_ecmult_gen_context *)cache_i->sk)->built + 1);
    pmVar179 = (musig_key_agg_vector *)(((musig_sign_verify_vector *)pmVar179)->pubkeys[1] + 0x17);
  } while (cache_i != (musig_sign_verify_vector *)0x4);
  nonce_01 = (musig_sign_verify_vector *)0x0;
  keyagg_cache_00 = (musig_nonce_agg_vector *)musig_sign_verify_vector.pubkeys;
  keyagg_cache = (musig_sign_verify_vector *)&sStack_d00;
  do {
    if (nonce_01 != (musig_sign_verify_vector *)0x0) {
      uVar165 = *(uint *)(nonce_01[0x21f].secnonces[1] + 0x92);
      sha2 = (musig_tweak_vector *)(ulong)uVar165;
      cache_i = (musig_sign_verify_vector *)(ulong)(uVar165 != 0);
      pmVar175 = (musig_sign_verify_vector *)aiStack_d40;
      pmStackY_df8 = (musig_sign_verify_vector *)0x151d7c;
      uVar151 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)auStack_960,
                           (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                           *(size_t *)(nonce_01[0x21f].secnonces[1] + 0x5a),
                           (size_t *)(nonce_01[0x21f].secnonces[1] + 0x62),0,(size_t *)0x0,
                           (int *)0x0);
      if (uVar151 != (uVar165 != 0)) goto LAB_0015295d;
      pmVar168 = (musig_sig_agg_vector *)sha2;
      if (uVar165 == 0) {
        cache_i = keyagg_cache;
        pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
        if (aiStack_d40[0] != 0) goto LAB_001529d0;
      }
      else {
        cache_i = (musig_sign_verify_vector *)(ulong)(uVar165 != 3);
        pmStackY_df8 = (musig_sign_verify_vector *)0x151dc9;
        pmVar175 = (musig_sign_verify_vector *)CTX;
        uVar151 = secp256k1_musig_aggnonce_parse
                            (CTX,(secp256k1_musig_aggnonce *)auStack_b30,
                             musig_sign_verify_vector.aggnonces
                             [*(long *)(nonce_01[0x21f].secnonces[1] + 0x7a)]);
        puVar156 = pubnonce->sk;
        if (uVar151 != (uVar165 != 3)) goto LAB_0015299e;
        if (uVar165 != 3) {
          pmStackY_df8 = (musig_sign_verify_vector *)0x151e19;
          pmVar175 = (musig_sign_verify_vector *)CTX;
          iVar147 = secp256k1_musig_nonce_process
                              (CTX,(secp256k1_musig_session *)auStack_700,
                               (secp256k1_musig_aggnonce *)auStack_b30,
                               musig_sign_verify_vector.msgs
                               [*(long *)(nonce_01[0x21f].secnonces[1] + 0x82)],
                               (secp256k1_musig_keyagg_cache *)auStack_960);
          cache_i = keyagg_cache;
          if (iVar147 == 0) goto LAB_001529da;
          pmStackY_df8 = (musig_sign_verify_vector *)0x151e38;
          pmVar175 = (musig_sign_verify_vector *)CTX;
          iVar147 = secp256k1_ec_pubkey_parse
                              (CTX,(secp256k1_pubkey *)keyagg_cache,
                               musig_sign_verify_vector.pubkeys[0],0x21);
          if (iVar147 == 0) goto LAB_001529df;
          pmVar179 = (musig_key_agg_vector *)auStack_a60;
          pmStackY_df8 = (musig_sign_verify_vector *)0x151e6a;
          musig_test_set_secnonce
                    ((secp256k1_musig_secnonce *)pmVar179,
                     musig_sign_verify_vector.secnonces
                     [*(long *)(nonce_01[0x21f].secnonces[1] + 0x8a)],
                     (secp256k1_pubkey *)keyagg_cache);
          pmVar175 = (musig_sign_verify_vector *)CTX;
          if (uVar165 == 4) {
            auStack_9a0._0_4_ = 0;
            p_Var143 = (CTX->illegal_callback).fn;
            pvVar144 = (CTX->illegal_callback).data;
            asStack_da0[0].data._0_4_ = SUB84(p_Var143,0);
            asStack_da0[0].data._4_4_ = (undefined4)((ulong)p_Var143 >> 0x20);
            asStack_da0[0].data._8_4_ = SUB84(pvVar144,0);
            asStack_da0[0].data._12_4_ = (undefined4)((ulong)pvVar144 >> 0x20);
            if (CTX == &secp256k1_context_static_) goto LAB_00152a02;
            (CTX->illegal_callback).fn = counting_callback_fn;
            (((secp256k1_context *)pmVar175)->illegal_callback).data = auStack_9a0;
            pmStackY_df8 = (musig_sign_verify_vector *)0x151eeb;
            iVar147 = secp256k1_musig_partial_sign
                                ((secp256k1_context *)pmVar175,
                                 (secp256k1_musig_partial_sig *)auStack_bb0,
                                 (secp256k1_musig_secnonce *)auStack_a60,
                                 (secp256k1_keypair *)auStack_c70,
                                 (secp256k1_musig_keyagg_cache *)auStack_960,
                                 (secp256k1_musig_session *)auStack_700);
            psVar181 = CTX;
            if (iVar147 != 0) goto LAB_00152a0c;
            (CTX->illegal_callback).fn =
                 (_func_void_char_ptr_void_ptr *)
                 CONCAT44(asStack_da0[0].data._4_4_,asStack_da0[0].data._0_4_);
            (psVar181->illegal_callback).data =
                 (void *)CONCAT44(asStack_da0[0].data._12_4_,asStack_da0[0].data._8_4_);
            if (auStack_9a0._0_4_ != 1) goto LAB_00152a11;
          }
          else {
            pmStackY_df8 = (musig_sign_verify_vector *)0x151f56;
            iVar147 = secp256k1_musig_partial_sign
                                (CTX,(secp256k1_musig_partial_sig *)auStack_bb0,
                                 (secp256k1_musig_secnonce *)pmVar179,
                                 (secp256k1_keypair *)auStack_c70,
                                 (secp256k1_musig_keyagg_cache *)auStack_960,
                                 (secp256k1_musig_session *)auStack_700);
            if (iVar147 == 0) goto LAB_00152a07;
          }
        }
      }
    }
    nonce_01 = (musig_sign_verify_vector *)
               ((((secp256k1_ecmult_gen_context *)nonce_01->sk)->ge_offset).x.n + 3);
  } while (nonce_01 != (musig_sign_verify_vector *)0x180);
  cache_i = (musig_sign_verify_vector *)musig_sign_verify_vector.verify_fail_case[0].nonce_indices;
  lVar152 = 0;
  do {
    keyagg_cache = (musig_sign_verify_vector *)
                   musig_sign_verify_vector.verify_fail_case[lVar152].nonce_indices_len;
    if (keyagg_cache < (musig_sign_verify_vector *)0x3) goto LAB_00152958;
    keyagg_cache_00 =
         (musig_nonce_agg_vector *)(musig_sign_verify_vector.verify_fail_case + lVar152);
    nonce_01 = (musig_sign_verify_vector *)auStack_960;
    sha2 = (musig_tweak_vector *)0x0;
    do {
      pmStackY_df8 = (musig_sign_verify_vector *)0x151fcb;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)nonce_01,
                           musig_sign_verify_vector.pubnonces
                           [(((secp256k1_ecmult_gen_context *)cache_i->sk)->scalar_offset).d
                            [(long)&((musig_sign_verify_vector *)((long)sha2 + -0xc98))->
                                    verify_error_case[1].field_0x77]]);
      if (iVar147 == 0) goto LAB_001528b3;
      *(musig_sign_verify_vector **)(auStack_bb0 + (long)sha2 * 8) = nonce_01;
      sha2 = (musig_tweak_vector *)
             ((long)&((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)sha2)->sk)->built
             + 1);
      nonce_01 = (musig_sign_verify_vector *)(nonce_01->pubkeys[3] + 1);
    } while (keyagg_cache != (musig_sign_verify_vector *)sha2);
    pmVar175 = (musig_sign_verify_vector *)asStack_da0;
    pmStackY_df8 = (musig_sign_verify_vector *)0x152025;
    iVar147 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)auStack_700,
                         (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                         musig_sign_verify_vector.verify_fail_case[lVar152].key_indices_len,
                         musig_sign_verify_vector.verify_fail_case[lVar152].key_indices,0,
                         (size_t *)0x0,(int *)0x0);
    if (iVar147 == 0) goto LAB_00152962;
    nonce_01 = (musig_sign_verify_vector *)auStack_a60;
    pmStackY_df8 = (musig_sign_verify_vector *)0x15204f;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_nonce_agg
                        (CTX,(secp256k1_musig_aggnonce *)nonce_01,
                         (secp256k1_musig_pubnonce **)auStack_bb0,(size_t)keyagg_cache);
    pmVar167 = pubnonce;
    if (iVar147 == 0) goto LAB_00152967;
    pmStackY_df8 = (musig_sign_verify_vector *)0x15208c;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_nonce_process
                        (CTX,(secp256k1_musig_session *)auStack_b30,
                         (secp256k1_musig_aggnonce *)nonce_01,
                         musig_sign_verify_vector.msgs
                         [musig_sign_verify_vector.verify_fail_case[lVar152].msg_index],
                         (secp256k1_musig_keyagg_cache *)auStack_700);
    if (iVar147 == 0) goto LAB_0015296c;
    pmStackY_df8 = (musig_sign_verify_vector *)0x1520c3;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)auStack_c70,
                         musig_sign_verify_vector.pubkeys
                         [musig_sign_verify_vector.verify_fail_case[lVar152].signer_index],0x21);
    sha2 = (musig_tweak_vector *)pubnonce;
    if (iVar147 == 0) goto LAB_00152971;
    MVar2 = musig_sign_verify_vector.verify_fail_case[lVar152].error;
    sha2 = (musig_tweak_vector *)(ulong)MVar2;
    nonce_01 = (musig_sign_verify_vector *)(ulong)(MVar2 != MUSIG_SIG);
    pmStackY_df8 = (musig_sign_verify_vector *)0x1520f0;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    uVar165 = secp256k1_musig_partial_sig_parse
                        (CTX,(secp256k1_musig_partial_sig *)&sStack_d00,(uchar *)keyagg_cache_00);
    pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
    if (uVar165 != (MVar2 != MUSIG_SIG)) goto LAB_00152976;
    if (MVar2 != MUSIG_SIG) {
      keyagg_cache_00 = (musig_nonce_agg_vector *)(ulong)(MVar2 != MUSIG_SIG_VERIFY);
      pmStackY_df8 = (musig_sign_verify_vector *)0x15213c;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      uVar165 = secp256k1_musig_partial_sig_verify
                          (CTX,(secp256k1_musig_partial_sig *)&sStack_d00,
                           (secp256k1_musig_pubnonce *)auStack_960,(secp256k1_pubkey *)auStack_c70,
                           (secp256k1_musig_keyagg_cache *)auStack_700,
                           (secp256k1_musig_session *)auStack_b30);
      pmVar168 = (musig_sig_agg_vector *)sha2;
      if (uVar165 != (MVar2 != MUSIG_SIG_VERIFY)) goto LAB_001529cb;
    }
    lVar152 = lVar152 + 1;
    cache_i = (musig_sign_verify_vector *)(cache_i->pubkeys[2] + 0x16);
  } while (lVar152 != 3);
  pmVar168 = (musig_sig_agg_vector *)CONCAT71((uint7)(uint3)(MVar2 >> 8),1);
  lVar152 = 0;
  keyagg_cache = (musig_sign_verify_vector *)auStack_960;
  do {
    pmVar167 = (musig_sign_verify_vector *)(lVar152 * 0x78);
    uVar165 = *(uint *)(pmVar167[0x21f].pubnonces[3] + 0xaa);
    cache_i = (musig_sign_verify_vector *)(ulong)uVar165;
    nonce_01 = (musig_sign_verify_vector *)(ulong)(uVar165 != 0);
    pmVar175 = (musig_sign_verify_vector *)auStack_b30;
    pmStackY_df8 = (musig_sign_verify_vector *)0x1521b8;
    uVar151 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)keyagg_cache,
                         (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                         *(size_t *)(pmVar167[0x21f].pubnonces[3] + 0x5a),
                         (size_t *)(pmVar167[0x21f].pubnonces[3] + 0x62),0,(size_t *)0x0,(int *)0x0)
    ;
    sha2 = (musig_tweak_vector *)pmVar168;
    puVar156 = pubnonce->sk;
    if (uVar151 != (uVar165 != 0)) goto LAB_0015297b;
    if (uVar165 == 0) {
      if (auStack_b30._0_4_ != 0) goto LAB_001529d5;
    }
    else {
      keyagg_cache_00 = (musig_nonce_agg_vector *)(ulong)(uVar165 != 2);
      pmStackY_df8 = (musig_sign_verify_vector *)0x152207;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      uVar151 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)auStack_700,
                           musig_sign_verify_vector.pubnonces
                           [*(long *)(pmVar167[0x21f].pubnonces[3] +
                                     *(long *)(pmVar167[0x21f].pubnonces[3] + 0xa2) * 8 + 0x82)]);
      pmVar167 = (musig_sign_verify_vector *)keyagg_cache_00;
      if (uVar151 != (uVar165 != 2)) goto LAB_001529c6;
    }
    lVar152 = 1;
    cVar164 = (char)pmVar168;
    pmVar168 = (musig_sig_agg_vector *)0x0;
  } while (cVar164 != '\0');
  pmStackY_df8 = (musig_sign_verify_vector *)0x15224d;
  pmVar175 = (musig_sign_verify_vector *)CTX;
  iVar147 = secp256k1_musig_aggnonce_parse
                      (CTX,(secp256k1_musig_aggnonce *)auStack_b30,musig_tweak_vector.aggnonce);
  if (iVar147 == 0) {
LAB_00152a2f:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152a34;
    run_musig_tests_cold_64();
    sha2 = (musig_tweak_vector *)pmVar168;
    keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
LAB_00152a34:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152a39;
    run_musig_tests_cold_63();
LAB_00152a39:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152a3e;
    run_musig_tests_cold_40();
    pmVar168 = (musig_sig_agg_vector *)sha2;
    pmVar167 = cache_i;
LAB_00152a3e:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152a43;
    run_musig_tests_cold_41();
LAB_00152a43:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152a48;
    run_musig_tests_cold_50();
LAB_00152a48:
    pmStackY_df8 = (musig_sign_verify_vector *)0x152a4d;
    run_musig_tests_cold_49();
  }
  else {
    pmStackY_df8 = (musig_sign_verify_vector *)0x152275;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)auStack_bb0,musig_tweak_vector.pubkeys[0],0x21);
    puVar156 = secp256k1_musig_partial_sig_magic;
    sha2 = (musig_tweak_vector *)pmVar168;
    keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
    if (iVar147 == 0) goto LAB_00152a34;
    nonce_01 = (musig_sign_verify_vector *)musig_tweak_vector.valid_case[0].expected;
    keyagg_cache = (musig_sign_verify_vector *)0x0;
    cache_i = (musig_sign_verify_vector *)auStack_960;
    do {
      pmVar167 = (musig_sign_verify_vector *)auStack_bb0;
      sha2 = &musig_tweak_vector;
      pmStackY_df8 = (musig_sign_verify_vector *)0x1522bc;
      musig_test_set_secnonce
                ((secp256k1_musig_secnonce *)auStack_a60,musig_tweak_vector.secnonce,
                 (secp256k1_pubkey *)pmVar167);
      pmStackY_df8 = (musig_sign_verify_vector *)0x1522d3;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_keypair_create(CTX,&sStack_d00,musig_tweak_vector.sk);
      if (iVar147 == 0) goto LAB_00152980;
      sha2 = (musig_tweak_vector *)(musig_tweak_vector.valid_case + (long)keyagg_cache);
      pmVar175 = (musig_sign_verify_vector *)auStack_9a0;
      pmStackY_df8 = (musig_sign_verify_vector *)0x152336;
      iVar147 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)cache_i,
                           (uchar *)0x0,musig_tweak_vector.pubkeys,musig_tweak_vector.tweaks,
                           *(size_t *)((musig_sign_verify_vector *)sha2)->sk,
                           musig_tweak_vector.valid_case[(long)keyagg_cache].key_indices,
                           musig_tweak_vector.valid_case[(long)keyagg_cache].tweak_indices_len,
                           musig_tweak_vector.valid_case[(long)keyagg_cache].tweak_indices,
                           musig_tweak_vector.valid_case[(long)keyagg_cache].is_xonly);
      pmVar179 = (musig_key_agg_vector *)keyagg_cache;
      pmVar167 = cache_i;
      if (iVar147 == 0) goto LAB_00152985;
      pmVar179 = (musig_key_agg_vector *)auStack_700;
      pmStackY_df8 = (musig_sign_verify_vector *)0x15236c;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_nonce_process
                          (CTX,(secp256k1_musig_session *)pmVar179,
                           (secp256k1_musig_aggnonce *)auStack_b30,musig_tweak_vector.msg,
                           (secp256k1_musig_keyagg_cache *)cache_i);
      if (iVar147 == 0) goto LAB_0015298a;
      pmStackY_df8 = (musig_sign_verify_vector *)0x15239e;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_partial_sign
                          (CTX,asStack_da0,(secp256k1_musig_secnonce *)auStack_a60,&sStack_d00,
                           (secp256k1_musig_keyagg_cache *)cache_i,
                           (secp256k1_musig_session *)pmVar179);
      if (iVar147 == 0) goto LAB_0015298f;
      lVar152 = 0;
      pmVar167 = (musig_sign_verify_vector *)auStack_c70;
      do {
        pmVar175 = (musig_sign_verify_vector *)CTX;
        if (asStack_da0[0].data[lVar152] != secp256k1_musig_partial_sig_magic[lVar152])
        goto LAB_00152a20;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 4);
      aiStack_d40[1]._0_1_ = asStack_da0[0].data[8];
      aiStack_d40[1]._1_1_ = asStack_da0[0].data[9];
      aiStack_d40[1]._2_1_ = asStack_da0[0].data[10];
      aiStack_d40[1]._3_1_ = asStack_da0[0].data[0xb];
      aiStack_d40[0]._0_1_ = asStack_da0[0].data[4];
      aiStack_d40[0]._1_1_ = asStack_da0[0].data[5];
      aiStack_d40[0]._2_1_ = asStack_da0[0].data[6];
      aiStack_d40[0]._3_1_ = asStack_da0[0].data[7];
      auStack_d30[0] = asStack_da0[0].data[0x14];
      auStack_d30[1] = asStack_da0[0].data[0x15];
      auStack_d30[2] = asStack_da0[0].data[0x16];
      auStack_d30[3] = asStack_da0[0].data[0x17];
      auStack_d30[4] = asStack_da0[0].data[0x18];
      auStack_d30[5] = asStack_da0[0].data[0x19];
      auStack_d30[6] = asStack_da0[0].data[0x1a];
      auStack_d30[7] = asStack_da0[0].data[0x1b];
      auStack_d28[0] = asStack_da0[0].data[0x1c];
      auStack_d28[1] = asStack_da0[0].data[0x1d];
      auStack_d28[2] = asStack_da0[0].data[0x1e];
      auStack_d28[3] = asStack_da0[0].data[0x1f];
      auStack_d28[4] = asStack_da0[0].data[0x20];
      auStack_d28[5] = asStack_da0[0].data[0x21];
      auStack_d28[6] = asStack_da0[0].data[0x22];
      auStack_d28[7] = asStack_da0[0].data[0x23];
      auStack_d38[0] = asStack_da0[0].data[0xc];
      auStack_d38[1] = asStack_da0[0].data[0xd];
      auStack_d38[2] = asStack_da0[0].data[0xe];
      auStack_d38[3] = asStack_da0[0].data[0xf];
      auStack_d38[4] = asStack_da0[0].data[0x10];
      auStack_d38[5] = asStack_da0[0].data[0x11];
      auStack_d38[6] = asStack_da0[0].data[0x12];
      auStack_d38[7] = asStack_da0[0].data[0x13];
      lVar152 = 0;
      do {
        pmVar168 = (musig_sig_agg_vector *)sha2;
        keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar167;
        if (*(char *)((long)aiStack_d40 + lVar152) !=
            *(char *)((long)(((secp256k1_ecmult_gen_context *)nonce_01->sk)->scalar_offset).d +
                     lVar152 + -8)) goto LAB_00152a25;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 0x20);
      sha2 = &musig_tweak_vector;
      pmStackY_df8 = (musig_sign_verify_vector *)0x15242c;
      iVar147 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)pmVar167,
                           musig_tweak_vector.pubnonces
                           [*(long *)((long)keyagg_cache * 0xa0 + 0x1ac058 +
                                     musig_tweak_vector.valid_case[(long)keyagg_cache].signer_index
                                     * 8)]);
      if (iVar147 == 0) goto LAB_00152994;
      keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_bb0;
      pmStackY_df8 = (musig_sign_verify_vector *)0x152459;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_partial_sig_verify
                          (CTX,asStack_da0,(secp256k1_musig_pubnonce *)pmVar167,
                           (secp256k1_pubkey *)keyagg_cache_00,
                           (secp256k1_musig_keyagg_cache *)cache_i,
                           (secp256k1_musig_session *)pmVar179);
      if (iVar147 == 0) goto LAB_00152999;
      keyagg_cache = (musig_sign_verify_vector *)
                     ((long)&((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->built + 1);
      nonce_01 = (musig_sign_verify_vector *)(nonce_01->pubkeys[3] + 0x1d);
    } while (keyagg_cache != (musig_sign_verify_vector *)0x5);
    pmVar175 = (musig_sign_verify_vector *)auStack_700;
    pmStackY_df8 = (musig_sign_verify_vector *)0x1524d1;
    iVar147 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)auStack_960,
                         (uchar *)0x0,musig_tweak_vector.pubkeys,musig_tweak_vector.tweaks,3,
                         musig_tweak_vector.error_case[0].key_indices,1,
                         musig_tweak_vector.error_case[0].tweak_indices,
                         musig_tweak_vector.error_case[0].is_xonly);
    if (iVar147 != 0) goto LAB_00152a39;
    pmVar168 = (musig_sig_agg_vector *)sha2;
    pmVar167 = cache_i;
    if (auStack_700._0_4_ != 1) goto LAB_00152a3e;
    puVar156 = (uchar *)musig_sig_agg_vector.valid_case[0].psig_indices;
    keyagg_cache = (musig_sign_verify_vector *)musig_sig_agg_vector.valid_case[0].expected;
    nonce_01 = (musig_sign_verify_vector *)0x0;
    do {
      pmVar168 = (musig_sig_agg_vector *)auStack_700;
      pmVar185 = (musig_sign_verify_vector *)((long)nonce_01 * 0xe8);
      pmVar175 = (musig_sign_verify_vector *)aiStack_d40;
      pmStackY_df8 = (musig_sign_verify_vector *)0x152562;
      iVar147 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)pmVar175,(secp256k1_musig_keyagg_cache *)pmVar168,
                           asStack_da0[0].data,(uchar (*) [33])&musig_sig_agg_vector,
                           musig_sig_agg_vector.tweaks,
                           *(size_t *)(pmVar185[0x220].pubnonces[1] + 0x2e),
                           (size_t *)(pmVar185[0x220].pubnonces[1] + 0x36),
                           *(size_t *)(pmVar185[0x220].pubnonces[1] + 0x46),
                           (size_t *)(pmVar185[0x220].pubnonces[1] + 0x4e),
                           (int *)(pmVar185[0x220].pubnonces[1] + 0x66));
      sha2 = (musig_tweak_vector *)&musig_sig_agg_vector;
      pmVar167 = (musig_sign_verify_vector *)pmVar168;
      keyagg_cache_00 = (musig_nonce_agg_vector *)pmVar185;
      if (iVar147 == 0) goto LAB_001529a3;
      keyagg_cache_00 = (musig_nonce_agg_vector *)(pmVar185[0x220].pubnonces[1] + 0x2e);
      pmVar167 = (musig_sign_verify_vector *)auStack_a60;
      pmStackY_df8 = (musig_sign_verify_vector *)0x152595;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_aggnonce_parse
                          (CTX,(secp256k1_musig_aggnonce *)pmVar167,
                           pmVar185[0x220].pubnonces[1] + 0x72);
      if (iVar147 == 0) goto LAB_001529a8;
      pmStackY_df8 = (musig_sign_verify_vector *)0x1525be;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_nonce_process
                          (CTX,(secp256k1_musig_session *)auStack_b30,
                           (secp256k1_musig_aggnonce *)pmVar167,musig_sig_agg_vector.msg,
                           (secp256k1_musig_keyagg_cache *)pmVar168);
      if (iVar147 == 0) goto LAB_001529ad;
      pmVar185 = *(musig_sign_verify_vector **)(pmVar185[0x220].pubnonces[1] + 0xb6);
      pmVar168 = &musig_sig_agg_vector;
      if (pmVar185 != (musig_sign_verify_vector *)0x0) {
        keyagg_cache_00 = (musig_nonce_agg_vector *)auStack_960;
        pmVar167 = (musig_sign_verify_vector *)0x0;
        do {
          pmStackY_df8 = (musig_sign_verify_vector *)0x15260c;
          pmVar175 = (musig_sign_verify_vector *)CTX;
          iVar147 = secp256k1_musig_partial_sig_parse
                              (CTX,(secp256k1_musig_partial_sig *)keyagg_cache_00,
                               musig_sig_agg_vector.psigs
                               [(((secp256k1_ecmult_gen_context *)
                                 ((musig_sign_verify_vector *)puVar156)->sk)->scalar_offset).d
                                [(long)&pmVar167[-1].verify_error_case[1].field_0x77]]);
          if (iVar147 == 0) goto LAB_001528c7;
          *(musig_nonce_agg_vector **)(auStack_c70 + (long)pmVar167 * 8) = keyagg_cache_00;
          pmVar167 = (musig_sign_verify_vector *)
                     ((long)&((secp256k1_ecmult_gen_context *)pmVar167->sk)->built + 1);
          keyagg_cache_00 =
               (musig_nonce_agg_vector *)
               ((long)(((secp256k1_ecmult_gen_context *)
                       ((musig_sign_verify_vector *)keyagg_cache_00)->sk)->scalar_offset).d + 0x1c);
        } while (pmVar185 != pmVar167);
      }
      keyagg_cache_00 = (musig_nonce_agg_vector *)&sStack_d00;
      pmStackY_df8 = (musig_sign_verify_vector *)0x152652;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_partial_sig_agg
                          (CTX,(uchar *)keyagg_cache_00,(secp256k1_musig_session *)auStack_b30,
                           (secp256k1_musig_partial_sig **)auStack_c70,(size_t)pmVar185);
      if (iVar147 != 1) goto LAB_001529b2;
      lVar152 = 0;
      cache_i = (musig_sign_verify_vector *)auStack_bb0;
      do {
        if (sStack_d00.data[lVar152] !=
            *(uchar *)((long)(((secp256k1_ecmult_gen_context *)keyagg_cache->sk)->scalar_offset).d +
                      lVar152 + -8)) goto LAB_00152a2a;
        lVar152 = lVar152 + 1;
      } while (lVar152 != 0x40);
      pmStackY_df8 = (musig_sign_verify_vector *)0x152698;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)cache_i,asStack_da0[0].data);
      pmVar167 = (musig_sign_verify_vector *)auStack_700;
      if (iVar147 == 0) goto LAB_001529b7;
      pmStackY_df8 = (musig_sign_verify_vector *)0x1526c6;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)keyagg_cache_00,musig_sig_agg_vector.msg,0x20,
                           (secp256k1_xonly_pubkey *)cache_i);
      if (iVar147 == 0) goto LAB_001529bc;
      nonce_01 = (musig_sign_verify_vector *)
                 ((long)&((secp256k1_ecmult_gen_context *)nonce_01->sk)->built + 1);
      puVar156 = ((musig_sign_verify_vector *)puVar156)->secnonces[0] + 0x44;
      keyagg_cache = (musig_sign_verify_vector *)(keyagg_cache->secnonces[0] + 0x44);
    } while (nonce_01 != (musig_sign_verify_vector *)0x4);
    sig = (secp256k1_musig_partial_sig *)auStack_960;
    puVar156 = (uchar *)CONCAT71((int7)((ulong)puVar156 >> 8),1);
    keyagg_cache_00 = (musig_nonce_agg_vector *)0x0;
    do {
      pmStackY_df8 = (musig_sign_verify_vector *)0x152717;
      pmVar175 = (musig_sign_verify_vector *)CTX;
      iVar147 = secp256k1_musig_partial_sig_parse
                          (CTX,sig,musig_sig_agg_vector.psigs
                                   [musig_sig_agg_vector.error_case[0].psig_indices
                                    [(long)keyagg_cache_00]]);
      if (iVar147 == (int)keyagg_cache_00) goto LAB_001529c1;
      keyagg_cache_00 = (musig_nonce_agg_vector *)0x1;
      sig = (secp256k1_musig_partial_sig *)(auStack_960 + 0x24);
      cVar164 = (char)puVar156;
      puVar156 = (uchar *)0x0;
    } while (cVar164 != '\0');
    sStack_d00.data[0x10] = '=';
    sStack_d00.data[0x11] = 'F';
    sStack_d00.data[0x12] = 'J';
    sStack_d00.data[0x13] = 'Y';
    sStack_d00.data[0x14] = 0xfe;
    sStack_d00.data[0x15] = 'l';
    sStack_d00.data[0x16] = 0x96;
    sStack_d00.data[0x17] = 0xa7;
    sStack_d00.data[0x18] = 0xef;
    sStack_d00.data[0x19] = 0xe8;
    sStack_d00.data[0x1a] = 'q';
    sStack_d00.data[0x1b] = 0xf0;
    sStack_d00.data[0x1c] = '|';
    sStack_d00.data[0x1d] = 'Z';
    sStack_d00.data[0x1e] = 0xef;
    sStack_d00.data[0x1f] = 'T';
    sStack_d00.data._0_8_ = (secp256k1_musig_pubnonce *)0xc554721b7dcbc1ee;
    sStack_d00.data[8] = 0xca;
    sStack_d00.data[9] = 0xb0;
    sStack_d00.data[10] = 0xd9;
    sStack_d00.data[0xb] = 0xc6;
    sStack_d00.data[0xc] = '\x1a';
    sStack_d00.data[0xd] = 0xb0;
    sStack_d00.data[0xe] = '.';
    sStack_d00.data[0xf] = 'd';
    pmStackY_df8 = (musig_sign_verify_vector *)0x15276a;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)auStack_b30,sStack_d00.data);
    if (iVar147 == 0) goto LAB_00152a43;
    uStack_c40 = uStack_ae0;
    uStack_c38 = uStack_ad8;
    auStack_c70._32_8_ = uStack_af0;
    uStack_c48 = uStack_ae8;
    auStack_c70._16_8_ = uStack_b00;
    auStack_c70._24_8_ = uStack_af8;
    auStack_c70._0_8_ = auStack_b30._32_8_;
    auStack_c70._8_8_ = uStack_b08;
    pmStackY_df8 = (musig_sign_verify_vector *)0x1527d6;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_nonce_gen_counter
                        (CTX,(secp256k1_musig_secnonce *)auStack_960,
                         (secp256k1_musig_pubnonce *)auStack_700,0,(secp256k1_keypair *)auStack_b30,
                         (uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar147 == 0) goto LAB_00152a48;
    lVar152 = 0;
    do {
      if (auStack_960[lVar152 + 4] != (&DAT_001acaa0)[lVar152]) goto LAB_00152a52;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x40);
    lVar152 = 0;
    do {
      if (auStack_920[lVar152 + 4] != auStack_c70[lVar152]) goto LAB_00152a57;
      lVar152 = lVar152 + 1;
    } while (lVar152 != 0x40);
    pmStackY_df8 = (musig_sign_verify_vector *)0x15283b;
    pmVar175 = (musig_sign_verify_vector *)CTX;
    iVar147 = secp256k1_musig_pubnonce_serialize
                        (CTX,auStack_a60,(secp256k1_musig_pubnonce *)auStack_700);
    if (iVar147 != 0) {
      lVar152 = 0;
      while (auStack_a60[lVar152] == (&DAT_001acae0)[lVar152]) {
        lVar152 = lVar152 + 1;
        if (lVar152 == 0x42) {
          return;
        }
      }
      goto LAB_00152a5c;
    }
  }
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a52;
  run_musig_tests_cold_48();
LAB_00152a52:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a57;
  run_musig_tests_cold_45();
LAB_00152a57:
  pmStackY_df8 = (musig_sign_verify_vector *)0x152a5c;
  run_musig_tests_cold_46();
LAB_00152a5c:
  pmStackY_df8 = (musig_sign_verify_vector *)secp256k1_ge_is_valid_var;
  run_musig_tests_cold_47();
  if ((int)(((secp256k1_ecmult_gen_context *)pmVar175->sk)->ge_offset).y.n[0] == 0) {
    uVar169 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->ge_offset).x.n[0];
    uVar154 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->ge_offset).x.n[1];
    uVar163 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->ge_offset).x.n[3];
    uVar159 = uVar169 * 2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar163;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar159;
    uVar170 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->ge_offset).x.n[2];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar170;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar154 * 2;
    uVar3 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->ge_offset).x.n[4];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar3;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar3;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar6 * auVar79,0);
    auVar132 = auVar4 * auVar77 + auVar5 * auVar78 + auVar7 * ZEXT816(0x1000003d10);
    uVar3 = uVar3 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar3;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar169;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar163;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar154 * 2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar170;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar170;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(auVar6 * auVar79,8);
    auVar4 = auVar11 * ZEXT816(0x1000003d10000) +
             auVar8 * auVar80 + auVar10 * auVar82 + auVar9 * auVar81 + (auVar132 >> 0x34);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar169;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar169;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar3;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar154;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar163;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar170 * 2;
    auVar5 = auVar14 * auVar85 + auVar13 * auVar84 + (auVar4 >> 0x34);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
    auVar6 = auVar15 * ZEXT816(0x1000003d1) + auVar12 * auVar83;
    uVar157 = auVar6._0_8_;
    uVar169 = auVar6._8_8_;
    auVar145._8_8_ = uVar169 >> 0x34;
    auVar145._0_8_ = uVar169 * 0x1000 | uVar157 >> 0x34;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar154;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar159;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar3;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar170;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar163;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar163;
    auVar5 = auVar18 * auVar88 + auVar17 * auVar87 + (auVar5 >> 0x34);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
    auVar145 = auVar19 * ZEXT816(0x1000003d10) + auVar16 * auVar86 + auVar145;
    uVar158 = auVar145._0_8_;
    uVar169 = auVar145._8_8_;
    auVar133._8_8_ = uVar169 >> 0x34;
    auVar133._0_8_ = uVar169 * 0x1000 | uVar158 >> 0x34;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar170;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar159;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar154;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar154;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar3;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar163;
    auVar5 = auVar22 * auVar91 + (auVar5 >> 0x34);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar5._0_8_;
    auVar133 = auVar23 * ZEXT816(0x1000003d10) + auVar21 * auVar90 + auVar20 * auVar89 + auVar133;
    auVar6 = auVar133 >> 0x34;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auVar6._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar5._8_8_;
    auVar137._8_8_ = auVar6._8_8_;
    auVar137._0_8_ = auVar132._0_8_ & 0xffffffffffffe;
    auVar138 = auVar24 * ZEXT816(0x1000003d10000) + auVar137 + auVar138;
    uVar171 = auVar138._0_8_;
    uVar169 = *(ulong *)pmVar175->sk;
    uVar154 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->scalar_offset).d[2];
    uVar159 = uVar169 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar154;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar159;
    uVar163 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->scalar_offset).d[0];
    uVar170 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->scalar_offset).d[1];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar170;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar163 * 2;
    uVar3 = (((secp256k1_ecmult_gen_context *)pmVar175->sk)->scalar_offset).d[3];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar3;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = SUB168(auVar27 * auVar94,0);
    auVar132 = auVar28 * ZEXT816(0x1000003d10) + auVar26 * auVar93 + auVar25 * auVar92;
    uVar178 = uVar3 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar178;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar169;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar154;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar163 * 2;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar170;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar170;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = SUB168(auVar27 * auVar94,8);
    auVar7 = auVar32 * ZEXT816(0x1000003d10000) +
             auVar29 * auVar95 + auVar31 * auVar97 + auVar30 * auVar96 + (auVar132 >> 0x34);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar169;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar169;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar178;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar163;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar154;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar170 * 2;
    auVar5 = auVar35 * auVar100 + auVar34 * auVar99 + (auVar7 >> 0x34);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
    auVar6 = auVar36 * ZEXT816(0x1000003d1) + auVar33 * auVar98;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar163;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar159;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar178;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar170;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar154;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar154;
    auVar5 = auVar39 * auVar103 + auVar38 * auVar102 + (auVar5 >> 0x34);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
    auVar8 = (auVar6 >> 0x34) + auVar37 * auVar101 + auVar40 * ZEXT816(0x1000003d10);
    uVar172 = auVar8._0_8_;
    uVar177 = auVar8._8_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar170;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar159;
    auVar134._8_8_ = uVar177 >> 0x34;
    auVar134._0_8_ = uVar177 * 0x1000 | uVar172 >> 0x34;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar163;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar163;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar178;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar154;
    auVar5 = auVar43 * auVar106 + (auVar5 >> 0x34);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar5._0_8_;
    auVar134 = auVar41 * auVar104 + auVar42 * auVar105 + auVar44 * ZEXT816(0x1000003d10) + auVar134;
    auVar8 = auVar134 >> 0x34;
    auVar139._8_8_ = auVar8._8_8_;
    auVar139._0_8_ = auVar132._0_8_ & 0xffffffffffffe;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auVar8._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auVar5._8_8_;
    auVar140 = auVar45 * ZEXT816(0x1000003d10000) + auVar139 + auVar140;
    uVar178 = auVar140._0_8_;
    uVar159 = auVar6._0_8_ & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar159;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar154;
    uVar187 = (auVar140._8_8_ << 0xc | uVar178 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
    uVar172 = uVar172 & 0xfffffffffffff;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar172;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar170;
    uVar183 = auVar134._0_8_ & 0xfffffffffffff;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar183;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar163;
    uVar178 = uVar178 & 0xfffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar178;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar169;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar187;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar3;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = SUB168(auVar50 * auVar111,0);
    auVar6 = auVar47 * auVar108 + auVar46 * auVar107 + auVar48 * auVar109 + auVar49 * auVar110 +
             auVar51 * ZEXT816(0x1000003d10);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar159;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar3;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar172;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar154;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar183;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar170;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar178;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar163;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar187;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar169;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = SUB168(auVar50 * auVar111,8);
    auVar132 = auVar57 * ZEXT816(0x1000003d10000) +
               auVar56 * auVar116 +
               auVar55 * auVar115 + auVar54 * auVar114 + auVar53 * auVar113 + auVar52 * auVar112 +
               (auVar6 >> 0x34);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar159;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar169;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar172;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar3;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar183;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar154;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar178;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar170;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar187;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar163;
    auVar5 = auVar62 * auVar121 + auVar61 * auVar120 + auVar60 * auVar119 + auVar59 * auVar118 +
             (auVar132 >> 0x34);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar132._6_2_ & 0xf);
    auVar7 = auVar63 * ZEXT816(0x1000003d1) + auVar58 * auVar117;
    uVar177 = auVar7._0_8_;
    uVar180 = auVar7._8_8_;
    auVar135._8_8_ = uVar180 >> 0x34;
    auVar135._0_8_ = uVar180 * 0x1000 | uVar177 >> 0x34;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar159;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar163;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar172;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar169;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar183;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar3;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar178;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar154;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar187;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar170;
    auVar5 = (auVar5 >> 0x34) + auVar68 * auVar126 + auVar67 * auVar125 + auVar66 * auVar124;
    uVar184 = auVar5._0_8_;
    uVar180 = auVar5._8_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar184 & 0xfffffffffffff;
    auVar135 = auVar69 * ZEXT816(0x1000003d10) + auVar65 * auVar123 + auVar64 * auVar122 + auVar135;
    auVar136._8_8_ = uVar180 >> 0x34;
    auVar136._0_8_ = uVar180 * 0x1000 | uVar184 >> 0x34;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar159;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar170;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar172;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar163;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar183;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar169;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar178;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar3;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar187;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar154;
    auVar136 = auVar74 * auVar131 + auVar73 * auVar130 + auVar136;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar136._0_8_;
    auVar5 = auVar75 * ZEXT816(0x1000003d10) +
             auVar72 * auVar129 + auVar71 * auVar128 + auVar70 * auVar127 + (auVar135 >> 0x34);
    auVar7 = auVar5 >> 0x34;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auVar7._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auVar136._8_8_;
    auVar141._8_8_ = auVar7._8_8_;
    auVar141._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar142 = auVar76 * ZEXT816(0x1000003d10000) + auVar141 + auVar142;
    uVar169 = auVar142._0_8_;
    sStackY_e48.n[0] =
         ((uVar177 & 0xfffffffffffff) - (uVar157 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
    sStackY_e48.n[1] =
         ((auVar135._0_8_ & 0xfffffffffffff) - (uVar158 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    sStackY_e48.n[2] =
         ((auVar5._0_8_ & 0xfffffffffffff) - (auVar133._0_8_ & 0xfffffffffffff)) + 0x3ffffffffffffc;
    sStackY_e48.n[3] =
         ((uVar169 & 0xfffffffffffff) - (uVar171 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    sStackY_e48.n[4] =
         ((auVar132._0_8_ & 0xffffffffffff) -
         ((auVar138._8_8_ << 0xc | uVar171 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff))) +
         0x3fffffffffffc + (auVar142._8_8_ << 0xc | uVar169 >> 0x34);
    pmStackY_e20 = (musig_sign_verify_vector *)pmVar168;
    pmStackY_e18 = keyagg_cache;
    pmStackY_e10 = pmVar167;
    pmStackY_e08 = (musig_sign_verify_vector *)keyagg_cache_00;
    pmStackY_e00 = nonce_01;
    pmStackY_df8 = (musig_sign_verify_vector *)puVar156;
    secp256k1_fe_impl_normalizes_to_zero(&sStackY_e48);
    return;
  }
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}